

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_fma::forward
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  uint uVar13;
  int *piVar14;
  void *pvVar15;
  undefined4 *puVar16;
  void *pvVar17;
  float *pfVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  int p;
  int iVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  undefined1 (*pauVar31) [32];
  uint uVar32;
  void *pvVar33;
  undefined1 (*pauVar34) [32];
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  long lVar40;
  uint uVar41;
  long lVar42;
  long lVar43;
  uint uVar44;
  long lVar45;
  long lVar46;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar66;
  undefined1 auVar60 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar159 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar102;
  undefined1 auVar100 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [28];
  undefined1 auVar136 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar114 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [64];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar158;
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar192 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar201 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  v4sf one;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar235 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [64];
  float fVar298;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar318;
  float fVar320;
  float fVar321;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  float fVar319;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [64];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar346 [64];
  undefined1 auVar347 [16];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [64];
  Option opt_flatten;
  undefined4 in_stack_fffffffffffffe8c;
  uint local_150;
  undefined1 local_138 [16];
  size_t local_128;
  int local_120;
  Allocator *local_118;
  int local_110;
  int local_10c;
  undefined8 local_108;
  int local_100;
  size_t local_f8;
  undefined1 local_e8 [16];
  ulong local_d0;
  InnerProduct_x86_fma *local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar63 [32];
  float fVar67;
  undefined1 auVar87 [32];
  float fVar101;
  undefined1 auVar135 [32];
  undefined1 auVar137 [32];
  
  auVar104 = in_ZMM12._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).int8_scale_term != 0)) {
    iVar26 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar26;
  }
  iVar26 = cpu_support_x86_f16c();
  if ((iVar26 != 0) && (opt->use_fp16_storage == true)) {
    iVar26 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar26;
  }
  local_110 = bottom_blob->dims;
  if (local_110 == 2) {
    iVar26 = (this->super_InnerProduct).num_output;
    local_10c = bottom_blob->w;
    if (local_10c == (this->super_InnerProduct).weight_data_size / iVar26) {
      Mat::create(top_blob,iVar26,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_InnerProduct).bias_data.data,
                 (this->super_InnerProduct).activation_type,
                 &(this->super_InnerProduct).activation_params,
                 (Option *)CONCAT44(in_stack_fffffffffffffe8c,(uint)opt->use_packing_layout));
      return 0;
    }
  }
  else {
    local_10c = bottom_blob->w;
  }
  piVar14 = bottom_blob->refcount;
  local_138._0_8_ = bottom_blob->data;
  local_138._8_8_ = bottom_blob->refcount;
  local_128 = bottom_blob->elemsize;
  local_120 = bottom_blob->elempack;
  local_118 = bottom_blob->allocator;
  local_108._0_4_ = bottom_blob->h;
  local_108._4_4_ = bottom_blob->d;
  local_100 = bottom_blob->c;
  local_f8 = bottom_blob->cstep;
  iVar26 = local_110;
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + 1;
    UNLOCK();
    iVar26 = bottom_blob->dims;
  }
  if (iVar26 != 1) {
    auVar240[0] = opt->lightmode;
    auVar240[1] = opt->use_shader_pack8;
    auVar240[2] = opt->use_subgroup_ops;
    auVar240[3] = opt->use_reserved_0;
    auVar240._4_4_ = opt->num_threads;
    auVar240._8_8_ = opt->blob_allocator;
    uVar7 = opt->workspace_allocator;
    uVar8 = opt->openmp_blocktime;
    uVar9 = opt->use_winograd_convolution;
    uVar10 = opt->use_sgemm_convolution;
    uVar11 = opt->use_int8_inference;
    uVar12 = opt->use_vulkan_compute;
    auVar240[0x1f] = uVar12;
    auVar240[0x1e] = uVar11;
    auVar240[0x1d] = uVar10;
    auVar240[0x1c] = uVar9;
    auVar240._24_4_ = uVar8;
    auVar240._16_8_ = uVar7;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_4_ = opt->vulkan_device_index;
    uStack_50._4_1_ = opt->use_reserved_1;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_2;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = opt->use_fp16_uniform;
    uStack_40._4_1_ = opt->use_int8_uniform;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    local_78 = auVar240._0_8_;
    pAStack_70 = opt->workspace_allocator;
    auStack_68 = auVar240._16_16_;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,local_138);
    if ((local_138._0_8_ == 0) || ((long)local_100 * local_f8 == 0)) {
      iVar26 = -100;
      goto LAB_002e29f6;
    }
  }
  uVar13 = (this->super_InnerProduct).num_output;
  lVar38 = 1;
  if (opt->use_packing_layout == true) {
    lVar38 = 8;
    if ((uVar13 & 7) != 0) {
      lVar38 = (ulong)((uVar13 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(int)uVar13 / (int)lVar38,lVar38 * (local_128 / (ulong)(long)local_120),
              (int)lVar38,opt->blob_allocator);
  iVar26 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar13 = (this->super_InnerProduct).activation_type;
    pvVar15 = (this->super_InnerProduct).bias_data.data;
    uVar44 = local_120 * local_10c;
    iVar27 = top_blob->elempack;
    uVar32 = top_blob->w;
    iVar26 = 0;
    uVar25 = local_138._0_8_;
    if (iVar27 == 1) {
      local_d0 = (ulong)(int)uVar32;
      lVar38 = (long)(int)uVar44;
      if (0 < (int)uVar32 >> 3) {
        local_88 = (ulong)(uint)((int)uVar32 >> 3);
        lVar30 = lVar38 * 0x1c;
        local_90 = lVar38 * 0x20;
        lVar46 = lVar38 * 8;
        lVar35 = lVar38 * 0x18;
        local_b0 = lVar38 * 4;
        local_b8 = lVar38 * 0xc;
        local_c0 = 0;
        auVar246 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar100 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar42 = lVar38 * 0x14;
        lVar40 = lVar38 << 4;
        uVar29 = 0;
        do {
          local_a8 = uVar29;
          local_a0 = lVar40;
          local_98 = lVar42;
          uVar29 = local_a8 * 8;
          auVar157 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar15 != (void *)0x0) {
            auVar157 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar15 + local_a8 * 0x20));
          }
          auVar240 = auVar157._0_32_;
          pvVar33 = (this->weight_data_tm).data;
          local_e8._0_8_ = lVar46;
          if ((int)uVar44 < 8) {
            uVar28 = 0;
            lVar42 = uVar29 * lVar38 * 4;
            lVar40 = (uVar29 | 1) * lVar38 * 4;
            lVar43 = (uVar29 | 2) * lVar38 * 4;
            lVar1 = (uVar29 | 3) * lVar38 * 4;
            lVar2 = (uVar29 | 4) * lVar38 * 4;
            lVar3 = (uVar29 | 5) * lVar38 * 4;
            lVar4 = (uVar29 | 6) * lVar38 * 4;
            lVar5 = (uVar29 | 7) * lVar38 * 4;
            auVar174 = SUB6432(ZEXT864(0),0);
            auVar54 = ZEXT816(0);
            auVar92 = SUB6432(ZEXT864(0),0);
            auVar197 = ZEXT816(0);
            auVar62 = SUB6432(ZEXT864(0),0);
            auVar90 = SUB6432(ZEXT864(0),0);
            auVar156 = SUB6432(ZEXT864(0),0);
            auVar159 = ZEXT816(0);
            pauVar34 = (undefined1 (*) [32])local_138._0_8_;
          }
          else {
            auVar159 = ZEXT816(0);
            iVar26 = 7;
            auVar297 = ZEXT864(0);
            auVar234 = ZEXT864(0);
            auVar370 = ZEXT864(0);
            auVar197 = ZEXT816(0);
            auVar191 = ZEXT864(0);
            auVar54 = ZEXT816(0);
            auVar339 = ZEXT864(0);
            lVar42 = 0;
            do {
              lVar45 = lVar42;
              auVar174 = *(undefined1 (*) [32])((undefined1 *)local_138._0_8_ + lVar45);
              auVar159 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar174,
                                         *(undefined1 (*) [32])((long)pvVar33 + lVar45 + local_c0));
              auVar104 = vfmadd231ps_fma(auVar297._0_32_,auVar174,
                                         *(undefined1 (*) [32])((long)pvVar33 + lVar45 + local_b0));
              auVar297 = ZEXT1664(auVar104);
              auVar156 = ZEXT1632(auVar104);
              auVar104 = vfmadd231ps_fma(auVar234._0_32_,auVar174,
                                         *(undefined1 (*) [32])((long)pvVar33 + lVar45 + lVar46));
              auVar234 = ZEXT1664(auVar104);
              auVar90 = ZEXT1632(auVar104);
              auVar104 = vfmadd231ps_fma(auVar370._0_32_,auVar174,
                                         *(undefined1 (*) [32])((long)pvVar33 + lVar45 + local_b8));
              auVar370 = ZEXT1664(auVar104);
              auVar62 = ZEXT1632(auVar104);
              auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar174,
                                         *(undefined1 (*) [32])((long)pvVar33 + lVar45 + local_a0));
              auVar104 = vfmadd231ps_fma(auVar191._0_32_,auVar174,
                                         *(undefined1 (*) [32])((long)pvVar33 + lVar45 + local_98));
              auVar191 = ZEXT1664(auVar104);
              auVar92 = ZEXT1632(auVar104);
              auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar174,
                                        *(undefined1 (*) [32])((long)pvVar33 + lVar45 + lVar35));
              auVar104 = vfmadd231ps_fma(auVar339._0_32_,auVar174,
                                         *(undefined1 (*) [32])((long)pvVar33 + lVar45 + lVar30));
              auVar339 = ZEXT1664(auVar104);
              auVar174 = ZEXT1632(auVar104);
              iVar26 = iVar26 + 8;
              lVar42 = lVar45 + 0x20;
            } while (iVar26 < (int)uVar44);
            lVar5 = lVar42 + lVar30;
            lVar4 = lVar42 + lVar35;
            lVar3 = lVar42 + local_98;
            lVar2 = lVar42 + local_a0;
            lVar1 = lVar42 + local_b8;
            lVar43 = lVar42 + lVar46;
            lVar40 = lVar42 + local_b0;
            lVar42 = lVar42 + local_c0;
            pauVar34 = (undefined1 (*) [32])
                       (*(undefined1 (*) [32])(local_138._0_8_ + 0x20) + lVar45);
            uVar28 = uVar44 & 0xfffffff8;
          }
          auVar104 = auVar156._0_16_;
          if (uVar44 - uVar28 != 0 && (int)uVar28 <= (int)uVar44) {
            lVar45 = 0;
            do {
              auVar355 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar33 + lVar45 * 4 + lVar2)),
                                       ZEXT416(*(uint *)((long)pvVar33 + lVar45 * 4 + lVar3)),0x10);
              auVar355 = vinsertps_avx(auVar355,ZEXT416(*(uint *)((long)pvVar33 + lVar45 * 4 + lVar4
                                                                 )),0x20);
              auVar355 = vinsertps_avx(auVar355,ZEXT416(*(uint *)((long)pvVar33 + lVar45 * 4 + lVar5
                                                                 )),0x30);
              auVar73 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar33 + lVar45 * 4 + lVar42)),
                                      ZEXT416(*(uint *)((long)pvVar33 + lVar45 * 4 + lVar40)),0x10);
              auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)((long)pvVar33 + lVar45 * 4 + lVar43)
                                                     ),0x20);
              auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)((long)pvVar33 + lVar45 * 4 + lVar1))
                                      ,0x30);
              uVar6 = *(undefined4 *)(*pauVar34 + lVar45 * 4);
              auVar242._4_4_ = uVar6;
              auVar242._0_4_ = uVar6;
              auVar242._8_4_ = uVar6;
              auVar242._12_4_ = uVar6;
              auVar242._16_4_ = uVar6;
              auVar242._20_4_ = uVar6;
              auVar242._24_4_ = uVar6;
              auVar242._28_4_ = uVar6;
              auVar287._16_16_ = auVar355;
              auVar287._0_16_ = auVar73;
              auVar355 = vfmadd231ps_fma(auVar157._0_32_,auVar287,auVar242);
              auVar157 = ZEXT1664(auVar355);
              auVar240 = ZEXT1632(auVar355);
              lVar45 = lVar45 + 1;
            } while (uVar44 - uVar28 != (int)lVar45);
          }
          auVar156 = vhaddps_avx(ZEXT1632(auVar159),auVar156);
          auVar62 = vhaddps_avx(auVar90,auVar62);
          auVar62 = vhaddps_avx(auVar156,auVar62);
          auVar92 = vhaddps_avx(ZEXT1632(auVar197),auVar92);
          auVar90 = vhaddps_avx(ZEXT1632(auVar54),auVar174);
          auVar90 = vhaddps_avx(auVar92,auVar90);
          auVar92 = vblendps_avx(auVar62,auVar90,0xf0);
          auVar90 = vperm2f128_avx(auVar62,auVar90,0x21);
          fVar102 = auVar90._0_4_ + auVar92._0_4_ + auVar240._0_4_;
          fVar66 = auVar90._4_4_ + auVar92._4_4_ + auVar240._4_4_;
          auVar62._0_8_ = CONCAT44(fVar66,fVar102);
          auVar62._8_4_ = auVar90._8_4_ + auVar92._8_4_ + auVar240._8_4_;
          auVar62._12_4_ = auVar90._12_4_ + auVar92._12_4_ + auVar240._12_4_;
          auVar62._16_4_ = auVar90._16_4_ + auVar92._16_4_ + auVar240._16_4_;
          auVar62._20_4_ = auVar90._20_4_ + auVar92._20_4_ + auVar240._20_4_;
          auVar62._24_4_ = auVar90._24_4_ + auVar92._24_4_ + auVar240._24_4_;
          auVar62._28_4_ = auVar90._28_4_ + auVar92._28_4_ + auVar240._28_4_;
          auVar92 = auVar100._0_32_;
          auVar240 = auVar246._0_32_;
          fVar298 = auVar246._0_4_;
          fVar158 = auVar246._4_4_;
          fVar318 = auVar246._8_4_;
          fVar319 = auVar246._12_4_;
          fVar320 = auVar246._16_4_;
          fVar321 = auVar246._20_4_;
          fVar67 = auVar246._24_4_;
          fVar101 = auVar246._28_4_;
          switch(uVar13) {
          case 1:
            auVar62 = vmaxps_avx(auVar92,auVar62);
            break;
          case 2:
            auVar240 = vmaxps_avx(auVar92,auVar62);
            auVar92 = vminps_avx(auVar92,auVar62);
            uVar6 = *(this->super_InnerProduct).activation_params.data;
            auVar65._4_4_ = uVar6;
            auVar65._0_4_ = uVar6;
            auVar65._8_4_ = uVar6;
            auVar65._12_4_ = uVar6;
            auVar65._16_4_ = uVar6;
            auVar65._20_4_ = uVar6;
            auVar65._24_4_ = uVar6;
            auVar65._28_4_ = uVar6;
            auVar159 = vfmadd213ps_fma(auVar65,auVar92,auVar240);
            auVar62 = ZEXT1632(auVar159);
            break;
          case 3:
            puVar16 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar6 = *puVar16;
            auVar95._4_4_ = uVar6;
            auVar95._0_4_ = uVar6;
            auVar95._8_4_ = uVar6;
            auVar95._12_4_ = uVar6;
            auVar95._16_4_ = uVar6;
            auVar95._20_4_ = uVar6;
            auVar95._24_4_ = uVar6;
            auVar95._28_4_ = uVar6;
            uVar6 = puVar16[1];
            auVar153._4_4_ = uVar6;
            auVar153._0_4_ = uVar6;
            auVar153._8_4_ = uVar6;
            auVar153._12_4_ = uVar6;
            auVar153._16_4_ = uVar6;
            auVar153._20_4_ = uVar6;
            auVar153._24_4_ = uVar6;
            auVar153._28_4_ = uVar6;
            auVar240 = vmaxps_avx(auVar62,auVar95);
            auVar62 = vminps_avx(auVar240,auVar153);
            break;
          case 4:
            auVar61._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
            auVar61._8_4_ = -auVar62._8_4_;
            auVar61._12_4_ = -auVar62._12_4_;
            auVar61._16_4_ = -auVar62._16_4_;
            auVar61._20_4_ = -auVar62._20_4_;
            auVar61._24_4_ = -auVar62._24_4_;
            auVar61._28_4_ = -auVar62._28_4_;
            auVar96._8_4_ = 0x42b0c0a5;
            auVar96._0_8_ = 0x42b0c0a542b0c0a5;
            auVar96._12_4_ = 0x42b0c0a5;
            auVar96._16_4_ = 0x42b0c0a5;
            auVar96._20_4_ = 0x42b0c0a5;
            auVar96._24_4_ = 0x42b0c0a5;
            auVar96._28_4_ = 0x42b0c0a5;
            auVar92 = vminps_avx(auVar61,auVar96);
            auVar97._8_4_ = 0xc2b0c0a5;
            auVar97._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar97._12_4_ = 0xc2b0c0a5;
            auVar97._16_4_ = 0xc2b0c0a5;
            auVar97._20_4_ = 0xc2b0c0a5;
            auVar97._24_4_ = 0xc2b0c0a5;
            auVar97._28_4_ = 0xc2b0c0a5;
            auVar62 = vmaxps_avx(auVar92,auVar97);
            auVar98._8_4_ = 0x3fb8aa3b;
            auVar98._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar98._12_4_ = 0x3fb8aa3b;
            auVar98._16_4_ = 0x3fb8aa3b;
            auVar98._20_4_ = 0x3fb8aa3b;
            auVar98._24_4_ = 0x3fb8aa3b;
            auVar98._28_4_ = 0x3fb8aa3b;
            auVar276._8_4_ = 0x3f000000;
            auVar276._0_8_ = 0x3f0000003f000000;
            auVar276._12_4_ = 0x3f000000;
            auVar276._16_4_ = 0x3f000000;
            auVar276._20_4_ = 0x3f000000;
            auVar276._24_4_ = 0x3f000000;
            auVar276._28_4_ = 0x3f000000;
            auVar159 = vfmadd213ps_fma(auVar98,auVar62,auVar276);
            auVar90 = vroundps_avx(ZEXT1632(auVar159),1);
            auVar92 = vcmpps_avx(ZEXT1632(auVar159),auVar90,1);
            auVar92 = vandps_avx(auVar92,auVar240);
            auVar92 = vsubps_avx(auVar90,auVar92);
            auVar154._8_4_ = 0x3f318000;
            auVar154._0_8_ = 0x3f3180003f318000;
            auVar154._12_4_ = 0x3f318000;
            auVar154._16_4_ = 0x3f318000;
            auVar154._20_4_ = 0x3f318000;
            auVar154._24_4_ = 0x3f318000;
            auVar154._28_4_ = 0x3f318000;
            auVar159 = vfmsub231ps_fma(auVar62,auVar92,auVar154);
            auVar155._8_4_ = 0x395e8083;
            auVar155._0_8_ = 0x395e8083395e8083;
            auVar155._12_4_ = 0x395e8083;
            auVar155._16_4_ = 0x395e8083;
            auVar155._20_4_ = 0x395e8083;
            auVar155._24_4_ = 0x395e8083;
            auVar155._28_4_ = 0x395e8083;
            auVar197 = vfmsub231ps_fma(ZEXT1632(auVar159),auVar92,auVar155);
            auVar62 = ZEXT1632(auVar197);
            auVar23._28_4_ = 0x395e8083;
            auVar23._0_28_ =
                 ZEXT1628(CONCAT412(auVar197._12_4_ * auVar197._12_4_,
                                    CONCAT48(auVar197._8_4_ * auVar197._8_4_,
                                             CONCAT44(auVar197._4_4_ * auVar197._4_4_,
                                                      auVar197._0_4_ * auVar197._0_4_))));
            auVar222._8_4_ = 0x39506967;
            auVar222._0_8_ = 0x3950696739506967;
            auVar222._12_4_ = 0x39506967;
            auVar222._16_4_ = 0x39506967;
            auVar222._20_4_ = 0x39506967;
            auVar222._24_4_ = 0x39506967;
            auVar222._28_4_ = 0x39506967;
            auVar244._8_4_ = 0x3ab743ce;
            auVar244._0_8_ = 0x3ab743ce3ab743ce;
            auVar244._12_4_ = 0x3ab743ce;
            auVar244._16_4_ = 0x3ab743ce;
            auVar244._20_4_ = 0x3ab743ce;
            auVar244._24_4_ = 0x3ab743ce;
            auVar244._28_4_ = 0x3ab743ce;
            auVar159 = vfmadd213ps_fma(auVar222,auVar62,auVar244);
            auVar245._8_4_ = 0x3c088908;
            auVar245._0_8_ = 0x3c0889083c088908;
            auVar245._12_4_ = 0x3c088908;
            auVar245._16_4_ = 0x3c088908;
            auVar245._20_4_ = 0x3c088908;
            auVar245._24_4_ = 0x3c088908;
            auVar245._28_4_ = 0x3c088908;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar62,auVar245);
            auVar189._8_4_ = 0x3d2aa9c1;
            auVar189._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar189._12_4_ = 0x3d2aa9c1;
            auVar189._16_4_ = 0x3d2aa9c1;
            auVar189._20_4_ = 0x3d2aa9c1;
            auVar189._24_4_ = 0x3d2aa9c1;
            auVar189._28_4_ = 0x3d2aa9c1;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar62,auVar189);
            auVar190._8_4_ = 0x3e2aaaaa;
            auVar190._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar190._12_4_ = 0x3e2aaaaa;
            auVar190._16_4_ = 0x3e2aaaaa;
            auVar190._20_4_ = 0x3e2aaaaa;
            auVar190._24_4_ = 0x3e2aaaaa;
            auVar190._28_4_ = 0x3e2aaaaa;
            auVar62 = ZEXT1632(auVar197);
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar62,auVar190);
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar62,auVar276);
            auVar54 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar23,auVar62);
            auVar53._0_4_ = (int)auVar92._0_4_;
            auVar53._4_4_ = (int)auVar92._4_4_;
            auVar53._8_4_ = (int)auVar92._8_4_;
            auVar53._12_4_ = (int)auVar92._12_4_;
            auVar63._16_4_ = (int)auVar92._16_4_;
            auVar63._0_16_ = auVar53;
            auVar63._20_4_ = (int)auVar92._20_4_;
            auVar63._24_4_ = (int)auVar92._24_4_;
            auVar63._28_4_ = (int)auVar92._28_4_;
            auVar197 = vpslld_avx(auVar53,0x17);
            auVar159 = vpslld_avx(auVar63._16_16_,0x17);
            auVar114._8_4_ = 0x3f800000;
            auVar114._0_8_ = 0x3f8000003f800000;
            auVar114._12_4_ = 0x3f800000;
            auVar159 = vpaddd_avx(auVar159,auVar114);
            auVar197 = vpaddd_avx(auVar197,auVar114);
            auVar64._16_16_ = auVar159;
            auVar64._0_16_ = auVar197;
            auVar99._0_4_ = auVar54._0_4_ + fVar298;
            auVar99._4_4_ = auVar54._4_4_ + fVar158;
            auVar99._8_4_ = auVar54._8_4_ + fVar318;
            auVar99._12_4_ = auVar54._12_4_ + fVar319;
            auVar99._16_4_ = fVar320 + 0.0;
            auVar99._20_4_ = fVar321 + 0.0;
            auVar99._24_4_ = fVar67 + 0.0;
            auVar99._28_4_ = fVar101 + 0.0;
            auVar159 = vfmadd213ps_fma(auVar64,auVar99,auVar240);
            auVar62 = vdivps_avx(auVar240,ZEXT1632(auVar159));
            break;
          case 5:
            auVar316._8_4_ = 0x42b0c0a5;
            auVar316._0_8_ = 0x42b0c0a542b0c0a5;
            auVar316._12_4_ = 0x42b0c0a5;
            auVar316._16_4_ = 0x42b0c0a5;
            auVar316._20_4_ = 0x42b0c0a5;
            auVar316._24_4_ = 0x42b0c0a5;
            auVar316._28_4_ = 0x42b0c0a5;
            auVar92 = vminps_avx(auVar316,auVar62);
            auVar336._8_4_ = 0xc2b0c0a5;
            auVar336._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar336._12_4_ = 0xc2b0c0a5;
            auVar336._16_4_ = 0xc2b0c0a5;
            auVar336._20_4_ = 0xc2b0c0a5;
            auVar336._24_4_ = 0xc2b0c0a5;
            auVar336._28_4_ = 0xc2b0c0a5;
            auVar90 = vmaxps_avx(auVar336,auVar92);
            auVar145._8_4_ = 0x3fb8aa3b;
            auVar145._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar145._12_4_ = 0x3fb8aa3b;
            auVar145._16_4_ = 0x3fb8aa3b;
            auVar145._20_4_ = 0x3fb8aa3b;
            auVar145._24_4_ = 0x3fb8aa3b;
            auVar145._28_4_ = 0x3fb8aa3b;
            auVar187._8_4_ = 0x3f000000;
            auVar187._0_8_ = 0x3f0000003f000000;
            auVar187._12_4_ = 0x3f000000;
            auVar187._16_4_ = 0x3f000000;
            auVar187._20_4_ = 0x3f000000;
            auVar187._24_4_ = 0x3f000000;
            auVar187._28_4_ = 0x3f000000;
            auVar104 = vfmadd213ps_fma(auVar145,auVar90,auVar187);
            auVar156 = vroundps_avx(ZEXT1632(auVar104),1);
            auVar92 = vcmpps_avx(ZEXT1632(auVar104),auVar156,1);
            auVar92 = vandps_avx(auVar92,auVar240);
            auVar92 = vsubps_avx(auVar156,auVar92);
            auVar352._8_4_ = 0x3f318000;
            auVar352._0_8_ = 0x3f3180003f318000;
            auVar352._12_4_ = 0x3f318000;
            auVar352._16_4_ = 0x3f318000;
            auVar352._20_4_ = 0x3f318000;
            auVar352._24_4_ = 0x3f318000;
            auVar352._28_4_ = 0x3f318000;
            auVar104 = vfmsub231ps_fma(auVar90,auVar92,auVar352);
            auVar337._8_4_ = 0xb95e8083;
            auVar337._0_8_ = 0xb95e8083b95e8083;
            auVar337._12_4_ = 0xb95e8083;
            auVar337._16_4_ = 0xb95e8083;
            auVar337._20_4_ = 0xb95e8083;
            auVar337._24_4_ = 0xb95e8083;
            auVar337._28_4_ = 0xb95e8083;
            auVar197 = vfnmsub231ps_fma(ZEXT1632(auVar104),auVar92,auVar337);
            auVar90 = ZEXT1632(auVar197);
            auVar174._28_4_ = auVar156._28_4_;
            auVar174._0_28_ =
                 ZEXT1628(CONCAT412(auVar197._12_4_ * auVar197._12_4_,
                                    CONCAT48(auVar197._8_4_ * auVar197._8_4_,
                                             CONCAT44(auVar197._4_4_ * auVar197._4_4_,
                                                      auVar197._0_4_ * auVar197._0_4_))));
            auVar369._8_4_ = 0x39506967;
            auVar369._0_8_ = 0x3950696739506967;
            auVar369._12_4_ = 0x39506967;
            auVar369._16_4_ = 0x39506967;
            auVar369._20_4_ = 0x39506967;
            auVar369._24_4_ = 0x39506967;
            auVar369._28_4_ = 0x39506967;
            auVar362._8_4_ = 0x3ab743ce;
            auVar362._0_8_ = 0x3ab743ce3ab743ce;
            auVar362._12_4_ = 0x3ab743ce;
            auVar362._16_4_ = 0x3ab743ce;
            auVar362._20_4_ = 0x3ab743ce;
            auVar362._24_4_ = 0x3ab743ce;
            auVar362._28_4_ = 0x3ab743ce;
            auVar104 = vfmadd213ps_fma(auVar369,auVar90,auVar362);
            auVar257._8_4_ = 0x3c088908;
            auVar257._0_8_ = 0x3c0889083c088908;
            auVar257._12_4_ = 0x3c088908;
            auVar257._16_4_ = 0x3c088908;
            auVar257._20_4_ = 0x3c088908;
            auVar257._24_4_ = 0x3c088908;
            auVar257._28_4_ = 0x3c088908;
            auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar90,auVar257);
            auVar188._8_4_ = 0x3d2aa9c1;
            auVar188._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar188._12_4_ = 0x3d2aa9c1;
            auVar188._16_4_ = 0x3d2aa9c1;
            auVar188._20_4_ = 0x3d2aa9c1;
            auVar188._24_4_ = 0x3d2aa9c1;
            auVar188._28_4_ = 0x3d2aa9c1;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar90,auVar188);
            auVar104._8_4_ = 0x3e2aaaaa;
            auVar104._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar104._12_4_ = 0x3e2aaaaa;
            auVar345._16_4_ = 0x3e2aaaaa;
            auVar345._0_16_ = auVar104;
            auVar345._20_4_ = 0x3e2aaaaa;
            auVar345._24_4_ = 0x3e2aaaaa;
            auVar345._28_4_ = 0x3e2aaaaa;
            auVar90 = ZEXT1632(auVar197);
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar90,auVar345);
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar90,auVar187);
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar174,auVar90);
            auVar219._0_4_ = fVar298 + auVar159._0_4_;
            auVar219._4_4_ = fVar158 + auVar159._4_4_;
            auVar219._8_4_ = fVar318 + auVar159._8_4_;
            auVar219._12_4_ = fVar319 + auVar159._12_4_;
            auVar219._16_4_ = fVar320 + 0.0;
            auVar219._20_4_ = fVar321 + 0.0;
            auVar219._24_4_ = fVar67 + 0.0;
            auVar219._28_4_ = fVar101 + 0.0;
            auVar159._0_4_ = (int)auVar92._0_4_;
            auVar159._4_4_ = (int)auVar92._4_4_;
            auVar159._8_4_ = (int)auVar92._8_4_;
            auVar159._12_4_ = (int)auVar92._12_4_;
            auVar91._16_4_ = (int)auVar92._16_4_;
            auVar91._0_16_ = auVar159;
            auVar91._20_4_ = (int)auVar92._20_4_;
            auVar91._24_4_ = (int)auVar92._24_4_;
            auVar91._28_4_ = (int)auVar92._28_4_;
            auVar197 = vpslld_avx(auVar159,0x17);
            auVar159 = vpslld_avx(auVar91._16_16_,0x17);
            auVar355._8_4_ = 0x3f800000;
            auVar355._0_8_ = 0x3f8000003f800000;
            auVar355._12_4_ = 0x3f800000;
            auVar159 = vpaddd_avx(auVar159,auVar355);
            auVar197 = vpaddd_avx(auVar197,auVar355);
            auVar92._16_16_ = auVar159;
            auVar92._0_16_ = auVar197;
            auVar54 = vfmadd213ps_fma(auVar92,auVar219,auVar240);
            auVar146._8_4_ = 0x800000;
            auVar146._0_8_ = 0x80000000800000;
            auVar146._12_4_ = 0x800000;
            auVar146._16_4_ = 0x800000;
            auVar146._20_4_ = 0x800000;
            auVar146._24_4_ = 0x800000;
            auVar146._28_4_ = 0x800000;
            auVar92 = vmaxps_avx(ZEXT1632(auVar54),auVar146);
            auVar197 = vpsrld_avx(auVar92._0_16_,0x17);
            auVar159 = vpsrld_avx(auVar92._16_16_,0x17);
            auVar271._8_4_ = 0x807fffff;
            auVar271._0_8_ = 0x807fffff807fffff;
            auVar271._12_4_ = 0x807fffff;
            auVar271._16_4_ = 0x807fffff;
            auVar271._20_4_ = 0x807fffff;
            auVar271._24_4_ = 0x807fffff;
            auVar271._28_4_ = 0x807fffff;
            auVar92 = vandps_avx(auVar271,auVar92);
            auVar156 = vorps_avx(auVar92,auVar187);
            auVar272._8_4_ = 0x3f3504f3;
            auVar272._0_8_ = 0x3f3504f33f3504f3;
            auVar272._12_4_ = 0x3f3504f3;
            auVar272._16_4_ = 0x3f3504f3;
            auVar272._20_4_ = 0x3f3504f3;
            auVar272._24_4_ = 0x3f3504f3;
            auVar272._28_4_ = 0x3f3504f3;
            auVar90 = vcmpps_avx(auVar272,auVar156,2);
            auVar92 = vandnps_avx(auVar90,auVar156);
            auVar258._8_4_ = 0xbf800000;
            auVar258._0_8_ = 0xbf800000bf800000;
            auVar258._12_4_ = 0xbf800000;
            auVar258._16_4_ = 0xbf800000;
            auVar258._20_4_ = 0xbf800000;
            auVar258._24_4_ = 0xbf800000;
            auVar258._28_4_ = 0xbf800000;
            auVar147._0_4_ = auVar92._0_4_ + auVar156._0_4_ + -1.0;
            auVar147._4_4_ = auVar92._4_4_ + auVar156._4_4_ + -1.0;
            auVar147._8_4_ = auVar92._8_4_ + auVar156._8_4_ + -1.0;
            auVar147._12_4_ = auVar92._12_4_ + auVar156._12_4_ + -1.0;
            auVar147._16_4_ = auVar92._16_4_ + auVar156._16_4_ + -1.0;
            auVar147._20_4_ = auVar92._20_4_ + auVar156._20_4_ + -1.0;
            auVar147._24_4_ = auVar92._24_4_ + auVar156._24_4_ + -1.0;
            auVar147._28_4_ = auVar92._28_4_ + auVar156._28_4_ + -1.0;
            auVar159 = vpsubd_avx(auVar159,auVar90._16_16_);
            auVar73._8_4_ = 0xffffff81;
            auVar73._0_8_ = 0xffffff81ffffff81;
            auVar73._12_4_ = 0xffffff81;
            auVar159 = vpaddd_avx(auVar73,auVar159);
            auVar197 = vpsubd_avx(auVar197,auVar90._0_16_);
            auVar197 = vpaddd_avx(auVar73,auVar197);
            auVar220._16_16_ = auVar159;
            auVar220._0_16_ = auVar197;
            auVar243._0_4_ = auVar147._0_4_ * auVar147._0_4_;
            auVar243._4_4_ = auVar147._4_4_ * auVar147._4_4_;
            auVar243._8_4_ = auVar147._8_4_ * auVar147._8_4_;
            auVar243._12_4_ = auVar147._12_4_ * auVar147._12_4_;
            auVar243._16_4_ = auVar147._16_4_ * auVar147._16_4_;
            auVar243._20_4_ = auVar147._20_4_ * auVar147._20_4_;
            auVar243._24_4_ = auVar147._24_4_ * auVar147._24_4_;
            auVar243._28_4_ = 0;
            auVar273._8_4_ = 0x3d9021bb;
            auVar273._0_8_ = 0x3d9021bb3d9021bb;
            auVar273._12_4_ = 0x3d9021bb;
            auVar273._16_4_ = 0x3d9021bb;
            auVar273._20_4_ = 0x3d9021bb;
            auVar273._24_4_ = 0x3d9021bb;
            auVar273._28_4_ = 0x3d9021bb;
            auVar288._8_4_ = 0xbdebd1b8;
            auVar288._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar288._12_4_ = 0xbdebd1b8;
            auVar288._16_4_ = 0xbdebd1b8;
            auVar288._20_4_ = 0xbdebd1b8;
            auVar288._24_4_ = 0xbdebd1b8;
            auVar288._28_4_ = 0xbdebd1b8;
            auVar159 = vfmadd213ps_fma(auVar273,auVar147,auVar288);
            auVar289._8_4_ = 0x3def251a;
            auVar289._0_8_ = 0x3def251a3def251a;
            auVar289._12_4_ = 0x3def251a;
            auVar289._16_4_ = 0x3def251a;
            auVar289._20_4_ = 0x3def251a;
            auVar289._24_4_ = 0x3def251a;
            auVar289._28_4_ = 0x3def251a;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar147,auVar289);
            auVar290._8_4_ = 0xbdfe5d4f;
            auVar290._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar290._12_4_ = 0xbdfe5d4f;
            auVar290._16_4_ = 0xbdfe5d4f;
            auVar290._20_4_ = 0xbdfe5d4f;
            auVar290._24_4_ = 0xbdfe5d4f;
            auVar290._28_4_ = 0xbdfe5d4f;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar147,auVar290);
            auVar291._8_4_ = 0x3e11e9bf;
            auVar291._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar291._12_4_ = 0x3e11e9bf;
            auVar291._16_4_ = 0x3e11e9bf;
            auVar291._20_4_ = 0x3e11e9bf;
            auVar291._24_4_ = 0x3e11e9bf;
            auVar291._28_4_ = 0x3e11e9bf;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar147,auVar291);
            auVar292._8_4_ = 0xbe2aae50;
            auVar292._0_8_ = 0xbe2aae50be2aae50;
            auVar292._12_4_ = 0xbe2aae50;
            auVar292._16_4_ = 0xbe2aae50;
            auVar292._20_4_ = 0xbe2aae50;
            auVar292._24_4_ = 0xbe2aae50;
            auVar292._28_4_ = 0xbe2aae50;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar147,auVar292);
            auVar293._8_4_ = 0x3e4cceac;
            auVar293._0_8_ = 0x3e4cceac3e4cceac;
            auVar293._12_4_ = 0x3e4cceac;
            auVar293._16_4_ = 0x3e4cceac;
            auVar293._20_4_ = 0x3e4cceac;
            auVar293._24_4_ = 0x3e4cceac;
            auVar293._28_4_ = 0x3e4cceac;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar147,auVar293);
            auVar294._8_4_ = 0xbe7ffffc;
            auVar294._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar294._12_4_ = 0xbe7ffffc;
            auVar294._16_4_ = 0xbe7ffffc;
            auVar294._20_4_ = 0xbe7ffffc;
            auVar294._24_4_ = 0xbe7ffffc;
            auVar294._28_4_ = 0xbe7ffffc;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar147,auVar294);
            auVar295._8_4_ = 0x3eaaaaaa;
            auVar295._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar295._12_4_ = 0x3eaaaaaa;
            auVar295._16_4_ = 0x3eaaaaaa;
            auVar295._20_4_ = 0x3eaaaaaa;
            auVar295._24_4_ = 0x3eaaaaaa;
            auVar295._28_4_ = 0x3eaaaaaa;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar147,auVar295);
            auVar274._0_4_ = auVar243._0_4_ * auVar147._0_4_ * auVar159._0_4_;
            auVar274._4_4_ = auVar243._4_4_ * auVar147._4_4_ * auVar159._4_4_;
            auVar274._8_4_ = auVar243._8_4_ * auVar147._8_4_ * auVar159._8_4_;
            auVar274._12_4_ = auVar243._12_4_ * auVar147._12_4_ * auVar159._12_4_;
            auVar274._16_4_ = auVar243._16_4_ * auVar147._16_4_ * 0.0;
            auVar274._20_4_ = auVar243._20_4_ * auVar147._20_4_ * 0.0;
            auVar274._24_4_ = auVar243._24_4_ * auVar147._24_4_ * 0.0;
            auVar274._28_4_ = 0;
            auVar90 = vcvtdq2ps_avx(auVar220);
            auVar159 = vfmadd231ps_fma(auVar274,auVar90,auVar337);
            auVar159 = vfmsub231ps_fma(ZEXT1632(auVar159),auVar187,auVar243);
            auVar92 = vcmpps_avx(ZEXT1632(auVar54),_DAT_005a5060,2);
            auVar156 = vsubps_avx(ZEXT1632(auVar159),auVar147);
            auVar159 = vfmsub231ps_fma(auVar156,auVar352,auVar90);
            auVar296._8_4_ = 0xc0000000;
            auVar296._0_8_ = 0xc0000000c0000000;
            auVar296._12_4_ = 0xc0000000;
            auVar296._16_4_ = 0xc0000000;
            auVar296._20_4_ = 0xc0000000;
            auVar296._24_4_ = 0xc0000000;
            auVar296._28_4_ = 0xc0000000;
            auVar148._0_4_ = auVar159._0_4_ * -2.0;
            auVar148._4_4_ = auVar159._4_4_ * -2.0;
            auVar148._8_4_ = auVar159._8_4_ * -2.0;
            auVar148._12_4_ = auVar159._12_4_ * -2.0;
            auVar148._16_4_ = 0x80000000;
            auVar148._20_4_ = 0x80000000;
            auVar148._24_4_ = 0x80000000;
            auVar148._28_4_ = 0;
            auVar221._8_4_ = 0x7fffffff;
            auVar221._0_8_ = 0x7fffffff7fffffff;
            auVar221._12_4_ = 0x7fffffff;
            auVar221._16_4_ = 0x7fffffff;
            auVar221._20_4_ = 0x7fffffff;
            auVar221._24_4_ = 0x7fffffff;
            auVar221._28_4_ = 0x7fffffff;
            auVar92 = vblendvps_avx(auVar148,auVar221,auVar92);
            auVar149._8_4_ = 0x42b0c0a5;
            auVar149._0_8_ = 0x42b0c0a542b0c0a5;
            auVar149._12_4_ = 0x42b0c0a5;
            auVar149._16_4_ = 0x42b0c0a5;
            auVar149._20_4_ = 0x42b0c0a5;
            auVar149._24_4_ = 0x42b0c0a5;
            auVar149._28_4_ = 0x42b0c0a5;
            auVar92 = vminps_avx(auVar92,auVar149);
            auVar150._8_4_ = 0xc2b0c0a5;
            auVar150._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar150._12_4_ = 0xc2b0c0a5;
            auVar150._16_4_ = 0xc2b0c0a5;
            auVar150._20_4_ = 0xc2b0c0a5;
            auVar150._24_4_ = 0xc2b0c0a5;
            auVar150._28_4_ = 0xc2b0c0a5;
            auVar90 = vmaxps_avx(auVar92,auVar150);
            auVar151._8_4_ = 0x3fb8aa3b;
            auVar151._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar151._12_4_ = 0x3fb8aa3b;
            auVar151._16_4_ = 0x3fb8aa3b;
            auVar151._20_4_ = 0x3fb8aa3b;
            auVar151._24_4_ = 0x3fb8aa3b;
            auVar151._28_4_ = 0x3fb8aa3b;
            auVar159 = vfmadd213ps_fma(auVar151,auVar90,auVar187);
            auVar156 = vroundps_avx(ZEXT1632(auVar159),1);
            auVar92 = vcmpps_avx(ZEXT1632(auVar159),auVar156,1);
            auVar92 = vandps_avx(auVar240,auVar92);
            auVar92 = vsubps_avx(auVar156,auVar92);
            auVar159 = vfmsub231ps_fma(auVar90,auVar92,auVar352);
            auVar197 = vfnmsub231ps_fma(ZEXT1632(auVar159),auVar92,auVar337);
            auVar90 = ZEXT1632(auVar197);
            auVar22._28_4_ = auVar156._28_4_;
            auVar22._0_28_ =
                 ZEXT1628(CONCAT412(auVar197._12_4_ * auVar197._12_4_,
                                    CONCAT48(auVar197._8_4_ * auVar197._8_4_,
                                             CONCAT44(auVar197._4_4_ * auVar197._4_4_,
                                                      auVar197._0_4_ * auVar197._0_4_))));
            auVar100 = ZEXT864(0) << 0x20;
            auVar159 = vfmadd213ps_fma(auVar369,auVar90,auVar362);
            auVar275._8_4_ = 0x3c088908;
            auVar275._0_8_ = 0x3c0889083c088908;
            auVar275._12_4_ = 0x3c088908;
            auVar275._16_4_ = 0x3c088908;
            auVar275._20_4_ = 0x3c088908;
            auVar275._24_4_ = 0x3c088908;
            auVar275._28_4_ = 0x3c088908;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar90,auVar275);
            auVar246 = ZEXT3264(auVar240);
            auVar317._8_4_ = 0x3d2aa9c1;
            auVar317._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar317._12_4_ = 0x3d2aa9c1;
            auVar317._16_4_ = 0x3d2aa9c1;
            auVar317._20_4_ = 0x3d2aa9c1;
            auVar317._24_4_ = 0x3d2aa9c1;
            auVar317._28_4_ = 0x3d2aa9c1;
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar90,auVar317);
            auVar90 = ZEXT1632(auVar197);
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar90,auVar345);
            auVar159 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar90,auVar187);
            auVar54 = vfmadd213ps_fma(ZEXT1632(auVar159),auVar22,auVar90);
            auVar197._0_4_ = (int)auVar92._0_4_;
            auVar197._4_4_ = (int)auVar92._4_4_;
            auVar197._8_4_ = (int)auVar92._8_4_;
            auVar197._12_4_ = (int)auVar92._12_4_;
            auVar93._16_4_ = (int)auVar92._16_4_;
            auVar93._0_16_ = auVar197;
            auVar93._20_4_ = (int)auVar92._20_4_;
            auVar93._24_4_ = (int)auVar92._24_4_;
            auVar93._28_4_ = (int)auVar92._28_4_;
            auVar197 = vpslld_avx(auVar197,0x17);
            auVar159 = vpslld_avx(auVar93._16_16_,0x17);
            auVar159 = vpaddd_avx(auVar159,auVar355);
            auVar197 = vpaddd_avx(auVar197,auVar355);
            auVar94._16_16_ = auVar159;
            auVar94._0_16_ = auVar197;
            auVar152._0_4_ = auVar54._0_4_ + fVar298;
            auVar152._4_4_ = auVar54._4_4_ + fVar158;
            auVar152._8_4_ = auVar54._8_4_ + fVar318;
            auVar152._12_4_ = auVar54._12_4_ + fVar319;
            auVar152._16_4_ = fVar320 + 0.0;
            auVar152._20_4_ = fVar321 + 0.0;
            auVar152._24_4_ = fVar67 + 0.0;
            auVar152._28_4_ = fVar101 + 0.0;
            auVar159 = vfmadd213ps_fma(auVar94,auVar152,auVar240);
            auVar240 = vdivps_avx(auVar240,ZEXT1632(auVar159));
            auVar159 = vfnmadd213ps_fma(auVar240,auVar296,auVar258);
            auVar134 = ZEXT1628(auVar159);
            goto LAB_002e1f59;
          case 6:
            puVar16 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar6 = *puVar16;
            auVar90._4_4_ = uVar6;
            auVar90._0_4_ = uVar6;
            auVar90._8_4_ = uVar6;
            auVar90._12_4_ = uVar6;
            auVar90._16_4_ = uVar6;
            auVar90._20_4_ = uVar6;
            auVar90._24_4_ = uVar6;
            auVar90._28_4_ = uVar6;
            uVar6 = puVar16[1];
            auVar156._4_4_ = uVar6;
            auVar156._0_4_ = uVar6;
            auVar156._8_4_ = uVar6;
            auVar156._12_4_ = uVar6;
            auVar156._16_4_ = uVar6;
            auVar156._20_4_ = uVar6;
            auVar156._24_4_ = uVar6;
            auVar156._28_4_ = uVar6;
            auVar159 = vfmadd231ps_fma(auVar156,auVar62,auVar90);
            auVar92 = vmaxps_avx(auVar92,ZEXT1632(auVar159));
            auVar240 = vminps_avx(auVar92,auVar240);
            auVar134 = auVar240._0_28_;
LAB_002e1f59:
            auVar62._4_4_ = auVar134._4_4_ * fVar66;
            auVar62._0_4_ = auVar134._0_4_ * fVar102;
            auVar62._8_4_ = auVar134._8_4_ * auVar62._8_4_;
            auVar62._12_4_ = auVar134._12_4_ * auVar62._12_4_;
            auVar62._16_4_ = auVar134._16_4_ * auVar62._16_4_;
            auVar62._20_4_ = auVar134._20_4_ * auVar62._20_4_;
            auVar62._24_4_ = auVar134._24_4_ * auVar62._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + local_a8 * 0x20) = auVar62;
          lVar30 = lVar30 + local_90;
          lVar35 = lVar35 + local_90;
          local_b8 = local_b8 + local_90;
          lVar46 = lVar46 + local_90;
          local_b0 = local_b0 + local_90;
          local_c0 = local_c0 + local_90;
          lVar42 = local_98 + local_90;
          lVar40 = local_a0 + local_90;
          uVar29 = local_a8 + 1;
          local_c8 = this;
          local_80 = (ulong)uVar13;
        } while (local_a8 + 1 != local_88);
      }
      uVar29 = local_d0 & 0xfffffffffffffff8;
      uVar28 = uVar32 >> 2 & 1;
      if (uVar28 != 0) {
        if (pvVar15 == (void *)0x0) {
          auVar159 = ZEXT816(0) << 0x40;
        }
        else {
          auVar159 = *(undefined1 (*) [16])((long)pvVar15 + uVar29 * 4);
        }
        pvVar17 = (this->weight_data_tm).data;
        pvVar33 = (void *)((long)pvVar17 + uVar29 * lVar38 * 4);
        if ((int)uVar44 < 8) {
          uVar39 = 0;
          lVar46 = (uVar29 | 1) * lVar38 * 4;
          lVar35 = (uVar29 | 2) * lVar38 * 4;
          lVar30 = (uVar29 | 3) * lVar38 * 4;
          auVar197 = ZEXT816(0);
          auVar54 = ZEXT816(0);
          auVar355 = ZEXT816(0);
          auVar73 = ZEXT816(0);
          pauVar34 = (undefined1 (*) [32])local_138._0_8_;
        }
        else {
          uVar39 = uVar44 & 0xfffffff8;
          lVar46 = (uVar29 + 3) * lVar38;
          lVar35 = (uVar29 + 2) * lVar38;
          lVar40 = (uVar29 + 1) * lVar38;
          auVar73 = ZEXT816(0);
          iVar26 = 7;
          auVar355 = ZEXT816(0);
          auVar54 = ZEXT816(0);
          auVar197 = ZEXT816(0);
          lVar42 = 0;
          do {
            lVar43 = lVar42;
            auVar240 = *(undefined1 (*) [32])((undefined1 *)local_138._0_8_ + lVar43);
            auVar197 = vfmadd231ps_fma(ZEXT1632(auVar197),auVar240,
                                       *(undefined1 (*) [32])((long)pvVar33 + lVar43));
            auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar240,
                                      *(undefined1 (*) [32])((long)pvVar17 + lVar43 + lVar40 * 4));
            auVar355 = vfmadd231ps_fma(ZEXT1632(auVar355),auVar240,
                                       *(undefined1 (*) [32])((long)pvVar17 + lVar43 + lVar35 * 4));
            auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar240,
                                      *(undefined1 (*) [32])((long)pvVar17 + lVar43 + lVar46 * 4));
            iVar26 = iVar26 + 8;
            lVar42 = lVar43 + 0x20;
          } while (iVar26 < (int)uVar44);
          lVar30 = lVar42 + lVar46 * 4;
          lVar35 = lVar42 + lVar35 * 4;
          lVar46 = lVar42 + lVar40 * 4;
          pvVar33 = (void *)((long)pvVar33 + lVar42);
          pauVar34 = (undefined1 (*) [32])(*(undefined1 (*) [32])(local_138._0_8_ + 0x20) + lVar43);
        }
        lVar46 = (long)pvVar17 + lVar46;
        lVar35 = (long)pvVar17 + lVar35;
        lVar30 = (long)pvVar17 + lVar30;
        auVar53 = ZEXT816(0) << 0x40;
        if ((int)(uVar39 | 3) < (int)uVar44) {
          auVar130 = ZEXT816(0);
          lVar42 = 0;
          auVar83 = ZEXT816(0);
          auVar246 = ZEXT864(0);
          uVar41 = uVar39;
          do {
            auVar131 = *(undefined1 (*) [16])(*pauVar34 + lVar42);
            auVar53 = vfmadd231ps_fma(auVar53,auVar131,
                                      *(undefined1 (*) [16])((long)pvVar33 + lVar42));
            auVar114 = vfmadd231ps_fma(auVar246._0_16_,auVar131,
                                       *(undefined1 (*) [16])(lVar46 + lVar42));
            auVar246 = ZEXT1664(auVar114);
            auVar83 = vfmadd231ps_fma(auVar83,auVar131,*(undefined1 (*) [16])(lVar35 + lVar42));
            auVar130 = vfmadd231ps_fma(auVar130,auVar131,*(undefined1 (*) [16])(lVar30 + lVar42));
            uVar39 = uVar41 + 4;
            iVar26 = uVar41 + 7;
            lVar42 = lVar42 + 0x10;
            uVar41 = uVar39;
          } while (iVar26 < (int)uVar44);
          pauVar34 = (undefined1 (*) [32])(*pauVar34 + lVar42);
          lVar30 = lVar30 + lVar42;
          lVar35 = lVar35 + lVar42;
          lVar46 = lVar46 + lVar42;
          pvVar33 = (void *)((long)pvVar33 + lVar42);
        }
        else {
          auVar114 = SUB6416(ZEXT864(0),0);
          auVar83 = ZEXT816(0);
          auVar130 = ZEXT816(0);
        }
        if (uVar44 - uVar39 != 0 && (int)uVar39 <= (int)uVar44) {
          lVar42 = 0;
          do {
            auVar131 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar33 + lVar42 * 4)),
                                     ZEXT416(*(uint *)(lVar46 + lVar42 * 4)),0x10);
            auVar131 = vinsertps_avx(auVar131,ZEXT416(*(uint *)(lVar35 + lVar42 * 4)),0x20);
            auVar131 = vinsertps_avx(auVar131,ZEXT416(*(uint *)(lVar30 + lVar42 * 4)),0x30);
            uVar6 = *(undefined4 *)(*pauVar34 + lVar42 * 4);
            auVar301._4_4_ = uVar6;
            auVar301._0_4_ = uVar6;
            auVar301._8_4_ = uVar6;
            auVar301._12_4_ = uVar6;
            auVar159 = vfmadd231ps_fma(auVar159,auVar131,auVar301);
            lVar42 = lVar42 + 1;
          } while (uVar44 - uVar39 != (int)lVar42);
        }
        auVar240 = vhaddps_avx(ZEXT1632(auVar197),ZEXT1632(auVar54));
        auVar92 = vhaddps_avx(ZEXT1632(auVar355),ZEXT1632(auVar73));
        auVar240 = vhaddps_avx(auVar240,auVar92);
        auVar355 = vunpcklps_avx(auVar53,auVar114);
        auVar73 = vunpcklps_avx(auVar83,auVar130);
        auVar54 = vunpckhps_avx(auVar53,auVar114);
        auVar53 = vunpckhps_avx(auVar83,auVar130);
        auVar197 = vmovlhps_avx(auVar355,auVar73);
        auVar73 = vunpckhpd_avx(auVar355,auVar73);
        auVar355 = vmovlhps_avx(auVar54,auVar53);
        auVar53 = vunpckhpd_avx(auVar54,auVar53);
        auVar54._0_4_ =
             auVar73._0_4_ + auVar197._0_4_ + auVar355._0_4_ + auVar53._0_4_ + auVar240._0_4_ +
             auVar240._16_4_ + auVar159._0_4_;
        auVar54._4_4_ =
             auVar73._4_4_ + auVar197._4_4_ + auVar355._4_4_ + auVar53._4_4_ + auVar240._4_4_ +
             auVar240._20_4_ + auVar159._4_4_;
        auVar54._8_4_ =
             auVar73._8_4_ + auVar197._8_4_ + auVar355._8_4_ + auVar53._8_4_ + auVar240._8_4_ +
             auVar240._24_4_ + auVar159._8_4_;
        auVar54._12_4_ =
             auVar73._12_4_ + auVar197._12_4_ + auVar355._12_4_ + auVar53._12_4_ + auVar240._12_4_ +
             auVar240._28_4_ + auVar159._12_4_;
        switch(uVar13) {
        case 1:
          auVar24._12_4_ = 0;
          auVar24._0_12_ = ZEXT412(0);
          auVar54 = vmaxps_avx(auVar54,auVar24 << 0x20);
          break;
        case 2:
          auVar159 = vmaxps_avx(auVar54,ZEXT416(0) << 0x20);
          auVar197 = vminps_avx(auVar54,ZEXT416(0) << 0x20);
          uVar6 = *(this->super_InnerProduct).activation_params.data;
          auVar58._4_4_ = uVar6;
          auVar58._0_4_ = uVar6;
          auVar58._8_4_ = uVar6;
          auVar58._12_4_ = uVar6;
          auVar54 = vfmadd213ps_fma(auVar58,auVar197,auVar159);
          break;
        case 3:
          puVar16 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar6 = *puVar16;
          auVar78._4_4_ = uVar6;
          auVar78._0_4_ = uVar6;
          auVar78._8_4_ = uVar6;
          auVar78._12_4_ = uVar6;
          uVar6 = puVar16[1];
          auVar127._4_4_ = uVar6;
          auVar127._0_4_ = uVar6;
          auVar127._8_4_ = uVar6;
          auVar127._12_4_ = uVar6;
          auVar159 = vmaxps_avx(auVar54,auVar78);
          auVar54 = vminps_avx(auVar159,auVar127);
          break;
        case 4:
          uVar36 = CONCAT44(auVar54._4_4_,auVar54._0_4_);
          auVar55._0_8_ = uVar36 ^ 0x8000000080000000;
          auVar55._8_4_ = -auVar54._8_4_;
          auVar55._12_4_ = -auVar54._12_4_;
          auVar79._8_4_ = 0x42b0c0a5;
          auVar79._0_8_ = 0x42b0c0a542b0c0a5;
          auVar79._12_4_ = 0x42b0c0a5;
          auVar159 = vminps_avx(auVar55,auVar79);
          auVar80._8_4_ = 0xc2b0c0a5;
          auVar80._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar80._12_4_ = 0xc2b0c0a5;
          auVar54 = vmaxps_avx(auVar159,auVar80);
          auVar56._8_4_ = 0x3fb8aa3b;
          auVar56._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar56._12_4_ = 0x3fb8aa3b;
          auVar128._8_4_ = 0x3f000000;
          auVar128._0_8_ = 0x3f0000003f000000;
          auVar128._12_4_ = 0x3f000000;
          auVar159 = vfmadd213ps_fma(auVar56,auVar54,auVar128);
          auVar172._0_4_ = (int)auVar159._0_4_;
          auVar172._4_4_ = (int)auVar159._4_4_;
          auVar172._8_4_ = (int)auVar159._8_4_;
          auVar172._12_4_ = (int)auVar159._12_4_;
          auVar197 = vcvtdq2ps_avx(auVar172);
          auVar159 = vcmpps_avx(auVar159,auVar197,1);
          auVar57._8_4_ = 0x3f800000;
          auVar57._0_8_ = 0x3f8000003f800000;
          auVar57._12_4_ = 0x3f800000;
          auVar159 = vandps_avx(auVar159,auVar57);
          auVar159 = vsubps_avx(auVar197,auVar159);
          auVar213._8_4_ = 0x3f318000;
          auVar213._0_8_ = 0x3f3180003f318000;
          auVar213._12_4_ = 0x3f318000;
          auVar197 = vfmsub213ps_fma(auVar213,auVar159,auVar54);
          auVar81._8_4_ = 0x395e8083;
          auVar81._0_8_ = 0x395e8083395e8083;
          auVar81._12_4_ = 0x395e8083;
          auVar54 = vfmsub213ps_fma(auVar81,auVar159,auVar197);
          auVar214._0_4_ = auVar54._0_4_ * auVar54._0_4_;
          auVar214._4_4_ = auVar54._4_4_ * auVar54._4_4_;
          auVar214._8_4_ = auVar54._8_4_ * auVar54._8_4_;
          auVar214._12_4_ = auVar54._12_4_ * auVar54._12_4_;
          auVar225._8_4_ = 0x3ab743ce;
          auVar225._0_8_ = 0x3ab743ce3ab743ce;
          auVar225._12_4_ = 0x3ab743ce;
          auVar237._8_4_ = 0x39506967;
          auVar237._0_8_ = 0x3950696739506967;
          auVar237._12_4_ = 0x39506967;
          auVar197 = vfmadd213ps_fma(auVar237,auVar54,auVar225);
          auVar226._8_4_ = 0x3c088908;
          auVar226._0_8_ = 0x3c0889083c088908;
          auVar226._12_4_ = 0x3c088908;
          auVar197 = vfmadd231ps_fma(auVar226,auVar54,auVar197);
          auVar238._8_4_ = 0x3d2aa9c1;
          auVar238._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar238._12_4_ = 0x3d2aa9c1;
          auVar197 = vfmadd231ps_fma(auVar238,auVar54,auVar197);
          auVar227._8_4_ = 0x3e2aaaaa;
          auVar227._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar227._12_4_ = 0x3e2aaaaa;
          auVar197 = vfmadd231ps_fma(auVar227,auVar54,auVar197);
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar128);
          auVar197 = vfmadd213ps_fma(auVar197,auVar214,auVar54);
          auVar82._0_4_ = auVar197._0_4_ + 1.0;
          auVar82._4_4_ = auVar197._4_4_ + 1.0;
          auVar82._8_4_ = auVar197._8_4_ + 1.0;
          auVar82._12_4_ = auVar197._12_4_ + 1.0;
          auVar129._0_4_ = (int)auVar159._0_4_;
          auVar129._4_4_ = (int)auVar159._4_4_;
          auVar129._8_4_ = (int)auVar159._8_4_;
          auVar129._12_4_ = (int)auVar159._12_4_;
          auVar159 = vpslld_avx(auVar129,0x17);
          auVar159 = vpaddd_avx(auVar159,auVar57);
          auVar159 = vfmadd213ps_fma(auVar159,auVar82,auVar57);
          auVar54 = vdivps_avx(auVar57,auVar159);
          break;
        case 5:
          auVar74._8_4_ = 0x42b0c0a5;
          auVar74._0_8_ = 0x42b0c0a542b0c0a5;
          auVar74._12_4_ = 0x42b0c0a5;
          auVar104 = vminps_avx(auVar54,auVar74);
          auVar115._8_4_ = 0xc2b0c0a5;
          auVar115._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar115._12_4_ = 0xc2b0c0a5;
          auVar197 = vmaxps_avx(auVar104,auVar115);
          auVar224._8_4_ = 0x3fb8aa3b;
          auVar224._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar224._12_4_ = 0x3fb8aa3b;
          auVar248._8_4_ = 0x3f000000;
          auVar248._0_8_ = 0x3f0000003f000000;
          auVar248._12_4_ = 0x3f000000;
          auVar104 = vfmadd213ps_fma(auVar224,auVar197,auVar248);
          auVar170._0_4_ = (int)auVar104._0_4_;
          auVar170._4_4_ = (int)auVar104._4_4_;
          auVar170._8_4_ = (int)auVar104._8_4_;
          auVar170._12_4_ = (int)auVar104._12_4_;
          auVar159 = vcvtdq2ps_avx(auVar170);
          auVar104 = vcmpps_avx(auVar104,auVar159,1);
          auVar236._8_4_ = 0x3f800000;
          auVar236._0_8_ = 0x3f8000003f800000;
          auVar236._12_4_ = 0x3f800000;
          auVar104 = vandps_avx(auVar104,auVar236);
          auVar159 = vsubps_avx(auVar159,auVar104);
          auVar171._8_4_ = 0x3f318000;
          auVar171._0_8_ = 0x3f3180003f318000;
          auVar171._12_4_ = 0x3f318000;
          auVar104 = vfmsub231ps_fma(auVar197,auVar159,auVar171);
          auVar268._8_4_ = 0xb95e8083;
          auVar268._0_8_ = 0xb95e8083b95e8083;
          auVar268._12_4_ = 0xb95e8083;
          auVar355 = vfnmsub231ps_fma(auVar104,auVar159,auVar268);
          auVar364._0_4_ = auVar355._0_4_ * auVar355._0_4_;
          auVar364._4_4_ = auVar355._4_4_ * auVar355._4_4_;
          auVar364._8_4_ = auVar355._8_4_ * auVar355._8_4_;
          auVar364._12_4_ = auVar355._12_4_ * auVar355._12_4_;
          auVar116._8_4_ = 0x3ab743ce;
          auVar116._0_8_ = 0x3ab743ce3ab743ce;
          auVar116._12_4_ = 0x3ab743ce;
          auVar75._8_4_ = 0x39506967;
          auVar75._0_8_ = 0x3950696739506967;
          auVar75._12_4_ = 0x39506967;
          auVar104 = vfmadd213ps_fma(auVar75,auVar355,auVar116);
          auVar302._8_4_ = 0x3c088908;
          auVar302._0_8_ = 0x3c0889083c088908;
          auVar302._12_4_ = 0x3c088908;
          auVar104 = vfmadd213ps_fma(auVar104,auVar355,auVar302);
          auVar330._8_4_ = 0x3d2aa9c1;
          auVar330._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar330._12_4_ = 0x3d2aa9c1;
          auVar197 = vfmadd213ps_fma(auVar104,auVar355,auVar330);
          auVar104._8_4_ = 0x3e2aaaaa;
          auVar104._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar104._12_4_ = 0x3e2aaaaa;
          auVar197 = vfmadd213ps_fma(auVar197,auVar355,auVar104);
          auVar197 = vfmadd213ps_fma(auVar197,auVar355,auVar248);
          auVar197 = vfmadd213ps_fma(auVar197,auVar364,auVar355);
          auVar202._0_4_ = auVar197._0_4_ + 1.0;
          auVar202._4_4_ = auVar197._4_4_ + 1.0;
          auVar202._8_4_ = auVar197._8_4_ + 1.0;
          auVar202._12_4_ = auVar197._12_4_ + 1.0;
          auVar354._0_4_ = (int)auVar159._0_4_;
          auVar354._4_4_ = (int)auVar159._4_4_;
          auVar354._8_4_ = (int)auVar159._8_4_;
          auVar354._12_4_ = (int)auVar159._12_4_;
          auVar159 = vpslld_avx(auVar354,0x17);
          auVar159 = vpaddd_avx(auVar159,auVar236);
          auVar159 = vfmadd213ps_fma(auVar159,auVar202,auVar236);
          auVar197 = vcmpps_avx(auVar159,ZEXT816(0) << 0x40,2);
          auVar203._8_4_ = 0x800000;
          auVar203._0_8_ = 0x80000000800000;
          auVar203._12_4_ = 0x800000;
          auVar159 = vmaxps_avx(auVar159,auVar203);
          auVar355 = vpsrld_avx(auVar159,0x17);
          auVar365._8_4_ = 0x807fffff;
          auVar365._0_8_ = 0x807fffff807fffff;
          auVar365._12_4_ = 0x807fffff;
          auVar159 = vandps_avx(auVar365,auVar159);
          auVar73 = vorps_avx(auVar159,auVar248);
          auVar366._8_4_ = 0xffffff82;
          auVar366._0_8_ = 0xffffff82ffffff82;
          auVar366._12_4_ = 0xffffff82;
          auVar53 = vpaddd_avx(auVar355,auVar366);
          auVar356._8_4_ = 0x3f3504f3;
          auVar356._0_8_ = 0x3f3504f33f3504f3;
          auVar356._12_4_ = 0x3f3504f3;
          auVar355 = vcmpps_avx(auVar73,auVar356,1);
          auVar159 = vandps_avx(auVar355,auVar73);
          auVar357._0_4_ = auVar73._0_4_ + -1.0 + auVar159._0_4_;
          auVar357._4_4_ = auVar73._4_4_ + -1.0 + auVar159._4_4_;
          auVar357._8_4_ = auVar73._8_4_ + -1.0 + auVar159._8_4_;
          auVar357._12_4_ = auVar73._12_4_ + -1.0 + auVar159._12_4_;
          auVar73 = vcvtdq2ps_avx(auVar53);
          auVar159 = vandps_avx(auVar355,auVar236);
          auVar159 = vsubps_avx(auVar73,auVar159);
          auVar117._8_4_ = 0xbdebd1b8;
          auVar117._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar117._12_4_ = 0xbdebd1b8;
          auVar204._8_4_ = 0x3d9021bb;
          auVar204._0_8_ = 0x3d9021bb3d9021bb;
          auVar204._12_4_ = 0x3d9021bb;
          auVar355 = vfmadd213ps_fma(auVar204,auVar357,auVar117);
          auVar118._8_4_ = 0x3def251a;
          auVar118._0_8_ = 0x3def251a3def251a;
          auVar118._12_4_ = 0x3def251a;
          auVar355 = vfmadd231ps_fma(auVar118,auVar357,auVar355);
          auVar205._8_4_ = 0xbdfe5d4f;
          auVar205._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar205._12_4_ = 0xbdfe5d4f;
          auVar355 = vfmadd231ps_fma(auVar205,auVar357,auVar355);
          auVar119._8_4_ = 0x3e11e9bf;
          auVar119._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar119._12_4_ = 0x3e11e9bf;
          auVar355 = vfmadd231ps_fma(auVar119,auVar357,auVar355);
          auVar206._8_4_ = 0xbe2aae50;
          auVar206._0_8_ = 0xbe2aae50be2aae50;
          auVar206._12_4_ = 0xbe2aae50;
          auVar355 = vfmadd231ps_fma(auVar206,auVar357,auVar355);
          auVar120._8_4_ = 0x3e4cceac;
          auVar120._0_8_ = 0x3e4cceac3e4cceac;
          auVar120._12_4_ = 0x3e4cceac;
          auVar355 = vfmadd231ps_fma(auVar120,auVar357,auVar355);
          auVar207._8_4_ = 0xbe7ffffc;
          auVar207._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar207._12_4_ = 0xbe7ffffc;
          auVar355 = vfmadd231ps_fma(auVar207,auVar357,auVar355);
          auVar121._8_4_ = 0x3eaaaaaa;
          auVar121._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar121._12_4_ = 0x3eaaaaaa;
          auVar355 = vfmadd231ps_fma(auVar121,auVar357,auVar355);
          auVar208._0_4_ = auVar357._0_4_ * auVar357._0_4_;
          auVar208._4_4_ = auVar357._4_4_ * auVar357._4_4_;
          auVar208._8_4_ = auVar357._8_4_ * auVar357._8_4_;
          auVar208._12_4_ = auVar357._12_4_ * auVar357._12_4_;
          auVar122._0_4_ = auVar357._0_4_ * auVar208._0_4_ * auVar355._0_4_;
          auVar122._4_4_ = auVar357._4_4_ * auVar208._4_4_ * auVar355._4_4_;
          auVar122._8_4_ = auVar357._8_4_ * auVar208._8_4_ * auVar355._8_4_;
          auVar122._12_4_ = auVar357._12_4_ * auVar208._12_4_ * auVar355._12_4_;
          auVar355 = vfmadd231ps_fma(auVar122,auVar159,auVar268);
          auVar355 = vfmsub231ps_fma(auVar355,auVar248,auVar208);
          auVar355 = vsubps_avx(auVar355,auVar357);
          auVar159 = vfnmadd231ps_fma(auVar355,auVar171,auVar159);
          auVar123._0_4_ = auVar159._0_4_ + auVar159._0_4_;
          auVar123._4_4_ = auVar159._4_4_ + auVar159._4_4_;
          auVar123._8_4_ = auVar159._8_4_ + auVar159._8_4_;
          auVar123._12_4_ = auVar159._12_4_ + auVar159._12_4_;
          auVar209._8_4_ = 0x7fffffff;
          auVar209._0_8_ = 0x7fffffff7fffffff;
          auVar209._12_4_ = 0x7fffffff;
          auVar159 = vblendvps_avx(auVar123,auVar209,auVar197);
          auVar210._8_4_ = 0x42b0c0a5;
          auVar210._0_8_ = 0x42b0c0a542b0c0a5;
          auVar210._12_4_ = 0x42b0c0a5;
          auVar159 = vminps_avx(auVar159,auVar210);
          auVar211._8_4_ = 0xc2b0c0a5;
          auVar211._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar211._12_4_ = 0xc2b0c0a5;
          auVar355 = vmaxps_avx(auVar159,auVar211);
          auVar159 = vfmadd213ps_fma(auVar224,auVar355,auVar248);
          auVar212._0_4_ = (int)auVar159._0_4_;
          auVar212._4_4_ = (int)auVar159._4_4_;
          auVar212._8_4_ = (int)auVar159._8_4_;
          auVar212._12_4_ = (int)auVar159._12_4_;
          auVar197 = vcvtdq2ps_avx(auVar212);
          auVar159 = vcmpps_avx(auVar159,auVar197,1);
          auVar159 = vandps_avx(auVar159,auVar236);
          auVar159 = vsubps_avx(auVar197,auVar159);
          auVar197 = vfmsub213ps_fma(auVar171,auVar159,auVar355);
          auVar355 = vfnmsub231ps_fma(auVar197,auVar159,auVar268);
          auVar124._8_4_ = 0x3ab743ce;
          auVar124._0_8_ = 0x3ab743ce3ab743ce;
          auVar124._12_4_ = 0x3ab743ce;
          auVar197 = vfmadd213ps_fma(auVar75,auVar355,auVar124);
          auVar197 = vfmadd213ps_fma(auVar197,auVar355,auVar302);
          auVar197 = vfmadd213ps_fma(auVar197,auVar355,auVar330);
          auVar197 = vfmadd213ps_fma(auVar197,auVar355,auVar104);
          auVar197 = vfmadd213ps_fma(auVar197,auVar355,auVar248);
          auVar125._0_4_ = auVar355._0_4_ * auVar355._0_4_;
          auVar125._4_4_ = auVar355._4_4_ * auVar355._4_4_;
          auVar125._8_4_ = auVar355._8_4_ * auVar355._8_4_;
          auVar125._12_4_ = auVar355._12_4_ * auVar355._12_4_;
          auVar197 = vfmadd213ps_fma(auVar197,auVar125,auVar355);
          auVar76._0_4_ = auVar197._0_4_ + 1.0;
          auVar76._4_4_ = auVar197._4_4_ + 1.0;
          auVar76._8_4_ = auVar197._8_4_ + 1.0;
          auVar76._12_4_ = auVar197._12_4_ + 1.0;
          auVar126._0_4_ = (int)auVar159._0_4_;
          auVar126._4_4_ = (int)auVar159._4_4_;
          auVar126._8_4_ = (int)auVar159._8_4_;
          auVar126._12_4_ = (int)auVar159._12_4_;
          auVar159 = vpslld_avx(auVar126,0x17);
          auVar159 = vpaddd_avx(auVar159,auVar236);
          auVar159 = vfmadd213ps_fma(auVar159,auVar76,auVar236);
          auVar77._8_4_ = 0x40000000;
          auVar77._0_8_ = 0x4000000040000000;
          auVar77._12_4_ = 0x40000000;
          auVar159 = vdivps_avx(auVar77,auVar159);
          auVar54 = vfmsub231ps_fma(auVar54,auVar54,auVar159);
          break;
        case 6:
          puVar16 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar6 = *puVar16;
          auVar83._4_4_ = uVar6;
          auVar83._0_4_ = uVar6;
          auVar83._8_4_ = uVar6;
          auVar83._12_4_ = uVar6;
          uVar6 = puVar16[1];
          auVar130._4_4_ = uVar6;
          auVar130._0_4_ = uVar6;
          auVar130._8_4_ = uVar6;
          auVar130._12_4_ = uVar6;
          auVar159 = vfmadd231ps_fma(auVar130,auVar54,auVar83);
          auVar159 = vmaxps_avx(auVar159,ZEXT416(0) << 0x20);
          auVar131._8_4_ = 0x3f800000;
          auVar131._0_8_ = 0x3f8000003f800000;
          auVar131._12_4_ = 0x3f800000;
          auVar159 = vminps_avx(auVar159,auVar131);
          auVar54._0_4_ = auVar159._0_4_ * auVar54._0_4_;
          auVar54._4_4_ = auVar159._4_4_ * auVar54._4_4_;
          auVar54._8_4_ = auVar159._8_4_ * auVar54._8_4_;
          auVar54._12_4_ = auVar159._12_4_ * auVar54._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar29 * 4) = auVar54;
      }
      iVar26 = 0;
      iVar27 = (int)uVar29 + uVar28 * 4;
      if ((int)uVar32 <= iVar27) goto LAB_002e29f6;
      pfVar18 = (float *)(this->super_InnerProduct).activation_params.data;
      pvVar33 = (this->weight_data_tm).data;
      pvVar17 = top_blob->data;
      local_150 = uVar44 & 0xfffffff8;
      uVar29 = (ulong)iVar27;
      auVar100 = ZEXT3264(_DAT_005a2740);
      auVar157 = ZEXT3264(_DAT_005a2760);
      local_e8._8_8_ = 0x8000000000000000;
      local_e8._0_8_ = 0x8000000000000000;
      auVar191 = ZEXT1664(local_e8);
      auVar104 = vpcmpeqd_avx(auVar104,auVar104);
      auVar246 = ZEXT1664(auVar104);
      do {
        auVar104 = ZEXT816(0) << 0x40;
        if (pvVar15 != (void *)0x0) {
          auVar104 = ZEXT416(*(uint *)((long)pvVar15 + uVar29 * 4));
        }
        pauVar34 = (undefined1 (*) [32])((long)pvVar33 + uVar29 * lVar38 * 4);
        pauVar31 = (undefined1 (*) [32])uVar25;
        if ((int)uVar44 < 8) {
          auVar240 = SUB6432(ZEXT864(0),0);
          uVar32 = 0;
        }
        else {
          auVar370 = ZEXT864(0);
          iVar26 = 7;
          do {
            auVar159 = vfmadd231ps_fma(auVar370._0_32_,*pauVar31,*pauVar34);
            auVar370 = ZEXT1664(auVar159);
            auVar240 = ZEXT1632(auVar159);
            pauVar31 = pauVar31 + 1;
            pauVar34 = pauVar34 + 1;
            iVar26 = iVar26 + 8;
            uVar32 = local_150;
          } while (iVar26 < (int)uVar44);
        }
        auVar159 = ZEXT816(0) << 0x40;
        uVar28 = uVar32 | 3;
        while ((int)uVar28 < (int)uVar44) {
          auVar159 = vfmadd231ps_fma(auVar159,*(undefined1 (*) [16])*pauVar31,
                                     *(undefined1 (*) [16])*pauVar34);
          pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
          pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
          uVar28 = uVar32 + 7;
          uVar32 = uVar32 + 4;
        }
        auVar197 = auVar191._0_16_;
        if ((int)uVar32 < (int)uVar44) {
          uVar36 = CONCAT44(0,~uVar32 + uVar44);
          auVar104 = vblendps_avx(auVar104,_DAT_005a14b0,0xe);
          auVar173._8_8_ = 0;
          auVar173._0_8_ = uVar36;
          auVar73 = vpshufd_avx(auVar173,0x44);
          auVar54 = vorps_avx(auVar197,auVar73);
          auVar355 = vorps_avx(auVar197,auVar73);
          uVar37 = 0;
          do {
            auVar130 = auVar104;
            auVar228._8_8_ = 0;
            auVar228._0_8_ = uVar37;
            auVar104 = vpshufd_avx(auVar228,0x44);
            auVar259._16_16_ = auVar104;
            auVar259._0_16_ = auVar104;
            auVar92 = vorps_avx(auVar100._0_32_,auVar259);
            auVar62 = vorps_avx(auVar157._0_32_,auVar259);
            auVar104 = vorps_avx(auVar73,auVar197);
            uVar32 = auVar191._0_4_;
            auVar269._0_4_ = auVar62._16_4_ ^ uVar32;
            uVar28 = auVar191._4_4_;
            auVar269._4_4_ = auVar62._20_4_ ^ uVar28;
            uVar39 = auVar191._8_4_;
            auVar269._8_4_ = auVar62._24_4_ ^ uVar39;
            uVar41 = auVar191._12_4_;
            auVar269._12_4_ = auVar62._28_4_ ^ uVar41;
            auVar114 = vpcmpgtq_avx(auVar269,auVar104);
            auVar303._0_4_ = uVar32 ^ auVar62._0_4_;
            auVar303._4_4_ = uVar28 ^ auVar62._4_4_;
            auVar303._8_4_ = uVar39 ^ auVar62._8_4_;
            auVar303._12_4_ = uVar41 ^ auVar62._12_4_;
            auVar53 = vpcmpgtq_avx(auVar303,auVar54);
            auVar53 = vpackssdw_avx(auVar53,auVar114);
            auVar331._0_4_ = auVar92._16_4_ ^ uVar32;
            auVar331._4_4_ = auVar92._20_4_ ^ uVar28;
            auVar331._8_4_ = auVar92._24_4_ ^ uVar39;
            auVar331._12_4_ = auVar92._28_4_ ^ uVar41;
            auVar83 = vpcmpgtq_avx(auVar331,auVar104);
            auVar332._0_4_ = uVar32 ^ auVar92._0_4_;
            auVar332._4_4_ = uVar28 ^ auVar92._4_4_;
            auVar332._8_4_ = uVar39 ^ auVar92._8_4_;
            auVar332._12_4_ = uVar41 ^ auVar92._12_4_;
            auVar104 = vpcmpgtq_avx(auVar332,auVar355);
            auVar104 = vpackssdw_avx(auVar104,auVar83);
            auVar104 = vpackssdw_avx(auVar104 ^ auVar246._0_16_,auVar53 ^ auVar246._0_16_);
            auVar53 = vpmovsxwd_avx(auVar104);
            auVar104 = vpunpckhwd_avx(auVar104,auVar104);
            auVar338._16_16_ = auVar104;
            auVar338._0_16_ = auVar53;
            auVar90 = vmaskmovps_avx(auVar338,*(undefined1 (*) [32])(*pauVar31 + uVar37 * 4));
            auVar156 = vmaskmovps_avx(auVar338,*(undefined1 (*) [32])(*pauVar34 + uVar37 * 4));
            auVar104 = vfmadd213ps_fma(auVar156,auVar90,ZEXT1632(auVar130));
            auVar53 = vpcmpeqd_avx(auVar90._0_16_,auVar90._0_16_);
            auVar246 = ZEXT1664(auVar53);
            uVar37 = uVar37 + 8;
          } while ((uVar36 + 8 & 0xfffffffffffffff8) != uVar37);
          auVar54 = vorps_avx(auVar197,auVar73);
          auVar239._0_4_ = uVar32 ^ auVar62._0_4_;
          auVar239._4_4_ = uVar28 ^ auVar62._4_4_;
          auVar239._8_4_ = uVar39 ^ auVar62._8_4_;
          auVar239._12_4_ = uVar41 ^ auVar62._12_4_;
          auVar54 = vpcmpgtq_avx(auVar239,auVar54);
          auVar54 = vpackssdw_avx(auVar54,auVar114);
          auVar197 = vorps_avx(auVar197,auVar73);
          auVar229._0_4_ = uVar32 ^ auVar92._0_4_;
          auVar229._4_4_ = uVar28 ^ auVar92._4_4_;
          auVar229._8_4_ = uVar39 ^ auVar92._8_4_;
          auVar229._12_4_ = uVar41 ^ auVar92._12_4_;
          auVar197 = vpcmpgtq_avx(auVar229,auVar197);
          auVar197 = vpackssdw_avx(auVar197,auVar83);
          auVar104 = vblendvps_avx(auVar130,auVar104,auVar53 ^ auVar197);
          auVar197 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar53 ^ auVar54);
          auVar104 = vhaddps_avx(auVar197,auVar104);
          auVar104 = vhaddps_avx(auVar104,auVar104);
          auVar104 = vhaddps_avx(auVar104,auVar104);
        }
        auVar59._0_4_ = auVar240._0_4_ + auVar240._16_4_ + auVar159._0_4_;
        auVar59._4_4_ = auVar240._4_4_ + auVar240._20_4_ + auVar159._4_4_;
        auVar59._8_4_ = auVar240._8_4_ + auVar240._24_4_ + auVar159._8_4_;
        auVar59._12_4_ = auVar240._12_4_ + auVar240._28_4_ + auVar159._12_4_;
        auVar159 = vhaddps_avx(auVar59,auVar59);
        auVar159 = vhaddps_avx(auVar159,auVar159);
        fVar102 = auVar159._0_4_ + auVar104._0_4_;
        auVar104 = ZEXT416((uint)fVar102);
        auVar159 = auVar246._0_16_;
        fVar66 = fVar102;
        switch(uVar13) {
        case 1:
          auVar104 = vmaxss_avx(auVar104,ZEXT416(0));
          fVar66 = auVar104._0_4_;
          break;
        case 2:
          auVar104 = vcmpss_avx(ZEXT816(0) << 0x20,auVar104,1);
          auVar133._8_4_ = 0x3f800000;
          auVar133._0_8_ = 0x3f8000003f800000;
          auVar133._12_4_ = 0x3f800000;
          auVar104 = vblendvps_avx(ZEXT416((uint)*pfVar18),auVar133,auVar104);
          fVar66 = auVar104._0_4_ * fVar102;
          break;
        case 3:
          auVar104 = vmaxss_avx(auVar104,ZEXT416((uint)*pfVar18));
          fVar66 = auVar104._0_4_;
          if (pfVar18[1] < auVar104._0_4_) {
            fVar66 = pfVar18[1];
          }
          break;
        case 4:
          auVar104 = vminss_avx(auVar104,ZEXT416(0x42b0c0a5));
          auVar84._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
          auVar84._8_4_ = auVar104._8_4_ ^ 0x80000000;
          auVar84._12_4_ = auVar104._12_4_ ^ 0x80000000;
          auVar104 = vcmpss_avx(auVar104,ZEXT416(0xc2b0c0a5),1);
          auVar132._8_4_ = 0x42b0c0a5;
          auVar132._0_8_ = 0x42b0c0a542b0c0a5;
          auVar132._12_4_ = 0x42b0c0a5;
          auVar104 = vblendvps_avx(auVar84,auVar132,auVar104);
          fVar102 = expf(auVar104._0_4_);
          auVar104 = vpcmpeqd_avx(auVar159,auVar159);
          auVar246 = ZEXT1664(auVar104);
          auVar191 = ZEXT1664(local_e8);
          auVar157 = ZEXT3264(_DAT_005a2760);
          auVar100 = ZEXT3264(_DAT_005a2740);
          fVar66 = 1.0 / (fVar102 + 1.0);
          break;
        case 5:
          fVar66 = expf(fVar102);
          fVar66 = logf(fVar66 + 1.0);
          fVar66 = tanhf(fVar66);
          auVar104 = vpcmpeqd_avx(auVar159,auVar159);
          auVar246 = ZEXT1664(auVar104);
          auVar191 = ZEXT1664(local_e8);
          auVar157 = ZEXT3264(_DAT_005a2760);
          auVar100 = ZEXT3264(_DAT_005a2740);
          fVar66 = fVar66 * fVar102;
          break;
        case 6:
          fVar298 = *pfVar18;
          fVar158 = -pfVar18[1] / fVar298;
          fVar66 = 0.0;
          if ((fVar158 <= fVar102) && (fVar66 = fVar102, fVar102 <= fVar158 + 1.0 / fVar298)) {
            auVar104 = vfmadd213ss_fma(ZEXT416((uint)fVar298),auVar104,ZEXT416((uint)pfVar18[1]));
            fVar66 = auVar104._0_4_ * fVar102;
          }
        }
        *(float *)((long)pvVar17 + uVar29 * 4) = fVar66;
        uVar29 = uVar29 + 1;
      } while (uVar29 != local_d0);
    }
    else if (iVar27 == 4) {
      if ((int)uVar32 < 1) goto LAB_002e29f6;
      uVar29 = 0;
      auVar223._8_4_ = 0x3f000000;
      auVar223._0_8_ = 0x3f0000003f000000;
      auVar223._12_4_ = 0x3f000000;
      auVar246 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar353._8_4_ = 0x3ab743ce;
      auVar353._0_8_ = 0x3ab743ce3ab743ce;
      auVar353._12_4_ = 0x3ab743ce;
      auVar300._8_4_ = 0x3c088908;
      auVar300._0_8_ = 0x3c0889083c088908;
      auVar300._12_4_ = 0x3c088908;
      auVar247._8_4_ = 0x3d2aa9c1;
      auVar247._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar247._12_4_ = 0x3d2aa9c1;
      do {
        auVar104 = ZEXT816(0) << 0x40;
        if (pvVar15 != (void *)0x0) {
          auVar104 = *(undefined1 (*) [16])((long)pvVar15 + uVar29 * 0x10);
        }
        pauVar34 = (undefined1 (*) [32])
                   ((long)(this->weight_data_tm).w * uVar29 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        pauVar31 = (undefined1 (*) [32])local_138._0_8_;
        if ((int)uVar44 < 8) {
          auVar92 = SUB6432(ZEXT864(0),0);
          auVar240 = SUB6432(ZEXT864(0),0);
          auVar157 = ZEXT864(0);
          auVar100 = ZEXT864(0);
          uVar28 = 0;
        }
        else {
          auVar100 = ZEXT864(0);
          iVar26 = 7;
          auVar157 = ZEXT864(0);
          auVar191 = ZEXT864(0);
          auVar370 = ZEXT864(0);
          do {
            uVar6 = *(undefined4 *)*pauVar31;
            auVar217._4_4_ = uVar6;
            auVar217._0_4_ = uVar6;
            auVar217._8_4_ = uVar6;
            auVar217._12_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 4);
            auVar217._20_4_ = uVar6;
            auVar217._16_4_ = uVar6;
            auVar217._24_4_ = uVar6;
            auVar217._28_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 8);
            auVar285._4_4_ = uVar6;
            auVar285._0_4_ = uVar6;
            auVar285._8_4_ = uVar6;
            auVar285._12_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 0xc);
            auVar285._20_4_ = uVar6;
            auVar285._16_4_ = uVar6;
            auVar285._24_4_ = uVar6;
            auVar285._28_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 0x10);
            auVar335._4_4_ = uVar6;
            auVar335._0_4_ = uVar6;
            auVar335._8_4_ = uVar6;
            auVar335._12_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 0x14);
            auVar335._20_4_ = uVar6;
            auVar335._16_4_ = uVar6;
            auVar335._24_4_ = uVar6;
            auVar335._28_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 0x18);
            auVar344._4_4_ = uVar6;
            auVar344._0_4_ = uVar6;
            auVar344._8_4_ = uVar6;
            auVar344._12_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 0x1c);
            auVar344._20_4_ = uVar6;
            auVar344._16_4_ = uVar6;
            auVar344._24_4_ = uVar6;
            auVar344._28_4_ = uVar6;
            auVar159 = vfmadd231ps_fma(auVar100._0_32_,auVar217,*pauVar34);
            auVar100 = ZEXT1664(auVar159);
            auVar159 = vfmadd231ps_fma(auVar157._0_32_,auVar285,pauVar34[1]);
            auVar157 = ZEXT1664(auVar159);
            auVar159 = vfmadd231ps_fma(auVar191._0_32_,auVar335,pauVar34[2]);
            auVar191 = ZEXT1664(auVar159);
            auVar240 = ZEXT1632(auVar159);
            auVar159 = vfmadd231ps_fma(auVar370._0_32_,auVar344,pauVar34[3]);
            auVar370 = ZEXT1664(auVar159);
            auVar92 = ZEXT1632(auVar159);
            pauVar31 = pauVar31 + 1;
            pauVar34 = pauVar34 + 4;
            iVar26 = iVar26 + 8;
            uVar28 = uVar44 & 0xfffffff8;
          } while (iVar26 < (int)uVar44);
        }
        auVar90 = auVar100._0_32_;
        auVar62 = auVar157._0_32_;
        uVar39 = uVar28 | 3;
        while ((int)uVar39 < (int)uVar44) {
          uVar6 = *(undefined4 *)*pauVar31;
          auVar218._4_4_ = uVar6;
          auVar218._0_4_ = uVar6;
          auVar218._8_4_ = uVar6;
          auVar218._12_4_ = uVar6;
          uVar6 = *(undefined4 *)(*pauVar31 + 4);
          auVar218._20_4_ = uVar6;
          auVar218._16_4_ = uVar6;
          auVar218._24_4_ = uVar6;
          auVar218._28_4_ = uVar6;
          uVar6 = *(undefined4 *)(*pauVar31 + 8);
          auVar286._4_4_ = uVar6;
          auVar286._0_4_ = uVar6;
          auVar286._8_4_ = uVar6;
          auVar286._12_4_ = uVar6;
          uVar6 = *(undefined4 *)(*pauVar31 + 0xc);
          auVar286._20_4_ = uVar6;
          auVar286._16_4_ = uVar6;
          auVar286._24_4_ = uVar6;
          auVar286._28_4_ = uVar6;
          auVar159 = vfmadd231ps_fma(auVar100._0_32_,auVar218,*pauVar34);
          auVar100 = ZEXT1664(auVar159);
          auVar90 = ZEXT1632(auVar159);
          auVar159 = vfmadd231ps_fma(auVar157._0_32_,auVar286,pauVar34[1]);
          auVar157 = ZEXT1664(auVar159);
          auVar62 = ZEXT1632(auVar159);
          pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
          pauVar34 = pauVar34 + 2;
          uVar39 = uVar28 + 7;
          uVar28 = uVar28 + 4;
        }
        if (uVar44 - uVar28 != 0 && (int)uVar28 <= (int)uVar44) {
          lVar38 = 0;
          do {
            uVar6 = *(undefined4 *)(*pauVar31 + lVar38 * 4);
            auVar193._4_4_ = uVar6;
            auVar193._0_4_ = uVar6;
            auVar193._8_4_ = uVar6;
            auVar193._12_4_ = uVar6;
            auVar104 = vfmadd231ps_fma(auVar104,auVar193,*(undefined1 (*) [16])*pauVar34);
            pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
            lVar38 = lVar38 + 1;
          } while (uVar44 - uVar28 != (int)lVar38);
        }
        fVar102 = auVar92._4_4_ + auVar240._4_4_ + auVar62._4_4_ + auVar90._4_4_;
        auVar69._0_4_ =
             auVar104._0_4_ +
             auVar92._16_4_ + auVar240._16_4_ + auVar62._16_4_ + auVar90._16_4_ +
             auVar92._0_4_ + auVar240._0_4_ + auVar62._0_4_ + auVar90._0_4_;
        auVar69._4_4_ = auVar104._4_4_ + fVar102 + fVar102;
        auVar69._8_4_ =
             auVar104._8_4_ +
             auVar92._24_4_ + auVar240._24_4_ + auVar62._24_4_ + auVar90._24_4_ +
             auVar92._8_4_ + auVar240._8_4_ + auVar62._8_4_ + auVar90._8_4_;
        auVar69._12_4_ =
             auVar104._12_4_ +
             auVar92._28_4_ + auVar240._28_4_ + auVar62._28_4_ + auVar90._28_4_ +
             auVar92._12_4_ + auVar240._12_4_ + auVar62._12_4_ + auVar90._12_4_;
        auVar104 = auVar246._0_16_;
        fVar102 = auVar246._0_4_;
        fVar66 = auVar246._4_4_;
        fVar298 = auVar246._8_4_;
        fVar158 = auVar246._12_4_;
        switch(uVar13) {
        case 1:
          auVar69 = vmaxps_avx(auVar69,_DAT_005a14b0);
          break;
        case 2:
          auVar104 = vmaxps_avx(auVar69,ZEXT816(0) << 0x40);
          auVar159 = vminps_avx(auVar69,ZEXT816(0) << 0x40);
          uVar6 = *(this->super_InnerProduct).activation_params.data;
          auVar72._4_4_ = uVar6;
          auVar72._0_4_ = uVar6;
          auVar72._8_4_ = uVar6;
          auVar72._12_4_ = uVar6;
          auVar69 = vfmadd213ps_fma(auVar72,auVar159,auVar104);
          break;
        case 3:
          puVar16 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar6 = *puVar16;
          auVar108._4_4_ = uVar6;
          auVar108._0_4_ = uVar6;
          auVar108._8_4_ = uVar6;
          auVar108._12_4_ = uVar6;
          uVar6 = puVar16[1];
          auVar165._4_4_ = uVar6;
          auVar165._0_4_ = uVar6;
          auVar165._8_4_ = uVar6;
          auVar165._12_4_ = uVar6;
          auVar104 = vmaxps_avx(auVar69,auVar108);
          auVar69 = vminps_avx(auVar104,auVar165);
          break;
        case 4:
          uVar36 = CONCAT44(auVar69._4_4_,auVar69._0_4_);
          auVar70._0_8_ = uVar36 ^ 0x8000000080000000;
          auVar70._8_4_ = -auVar69._8_4_;
          auVar70._12_4_ = -auVar69._12_4_;
          auVar109._8_4_ = 0x42b0c0a5;
          auVar109._0_8_ = 0x42b0c0a542b0c0a5;
          auVar109._12_4_ = 0x42b0c0a5;
          auVar159 = vminps_avx(auVar70,auVar109);
          auVar110._8_4_ = 0xc2b0c0a5;
          auVar110._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar110._12_4_ = 0xc2b0c0a5;
          auVar54 = vmaxps_avx(auVar159,auVar110);
          auVar111._8_4_ = 0x3fb8aa3b;
          auVar111._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar111._12_4_ = 0x3fb8aa3b;
          auVar159 = vfmadd213ps_fma(auVar111,auVar54,auVar223);
          auVar166._0_4_ = (int)auVar159._0_4_;
          auVar166._4_4_ = (int)auVar159._4_4_;
          auVar166._8_4_ = (int)auVar159._8_4_;
          auVar166._12_4_ = (int)auVar159._12_4_;
          auVar197 = vcvtdq2ps_avx(auVar166);
          auVar159 = vcmpps_avx(auVar159,auVar197,1);
          auVar159 = vandps_avx(auVar159,auVar104);
          auVar159 = vsubps_avx(auVar197,auVar159);
          auVar50._8_4_ = 0x3f318000;
          auVar50._0_8_ = 0x3f3180003f318000;
          auVar50._12_4_ = 0x3f318000;
          auVar197 = vfmsub231ps_fma(auVar54,auVar159,auVar50);
          auVar167._8_4_ = 0x395e8083;
          auVar167._0_8_ = 0x395e8083395e8083;
          auVar167._12_4_ = 0x395e8083;
          auVar54 = vfmsub231ps_fma(auVar197,auVar159,auVar167);
          auVar168._0_4_ = auVar54._0_4_ * auVar54._0_4_;
          auVar168._4_4_ = auVar54._4_4_ * auVar54._4_4_;
          auVar168._8_4_ = auVar54._8_4_ * auVar54._8_4_;
          auVar168._12_4_ = auVar54._12_4_ * auVar54._12_4_;
          auVar201._8_4_ = 0x39506967;
          auVar201._0_8_ = 0x3950696739506967;
          auVar201._12_4_ = 0x39506967;
          auVar266._8_4_ = 0x3ab743ce;
          auVar266._0_8_ = 0x3ab743ce3ab743ce;
          auVar266._12_4_ = 0x3ab743ce;
          auVar197 = vfmadd213ps_fma(auVar201,auVar54,auVar266);
          auVar267._8_4_ = 0x3c088908;
          auVar267._0_8_ = 0x3c0889083c088908;
          auVar267._12_4_ = 0x3c088908;
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar267);
          auVar51._8_4_ = 0x3d2aa9c1;
          auVar51._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar51._12_4_ = 0x3d2aa9c1;
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar51);
          auVar52._8_4_ = 0x3e2aaaaa;
          auVar52._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar52._12_4_ = 0x3e2aaaaa;
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar52);
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar223);
          auVar197 = vfmadd213ps_fma(auVar197,auVar168,auVar54);
          auVar71._0_4_ = auVar197._0_4_ + fVar102;
          auVar71._4_4_ = auVar197._4_4_ + fVar66;
          auVar71._8_4_ = auVar197._8_4_ + fVar298;
          auVar71._12_4_ = auVar197._12_4_ + fVar158;
          auVar112._0_4_ = (int)auVar159._0_4_;
          auVar112._4_4_ = (int)auVar159._4_4_;
          auVar112._8_4_ = (int)auVar159._8_4_;
          auVar112._12_4_ = (int)auVar159._12_4_;
          auVar159 = vpslld_avx(auVar112,0x17);
          auVar159 = vpaddd_avx(auVar159,auVar104);
          auVar159 = vfmadd213ps_fma(auVar159,auVar71,auVar104);
          auVar69 = vdivps_avx(auVar104,auVar159);
          break;
        case 5:
          auVar340._8_4_ = 0x42b0c0a5;
          auVar340._0_8_ = 0x42b0c0a542b0c0a5;
          auVar340._12_4_ = 0x42b0c0a5;
          auVar159 = vminps_avx(auVar340,auVar69);
          auVar347._8_4_ = 0xc2b0c0a5;
          auVar347._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar347._12_4_ = 0xc2b0c0a5;
          auVar54 = vmaxps_avx(auVar347,auVar159);
          auVar363._8_4_ = 0x3fb8aa3b;
          auVar363._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar363._12_4_ = 0x3fb8aa3b;
          auVar159 = vfmadd213ps_fma(auVar363,auVar54,auVar223);
          auVar194._0_4_ = (int)auVar159._0_4_;
          auVar194._4_4_ = (int)auVar159._4_4_;
          auVar194._8_4_ = (int)auVar159._8_4_;
          auVar194._12_4_ = (int)auVar159._12_4_;
          auVar197 = vcvtdq2ps_avx(auVar194);
          auVar159 = vcmpps_avx(auVar159,auVar197,1);
          auVar159 = vandps_avx(auVar159,auVar104);
          auVar159 = vsubps_avx(auVar197,auVar159);
          auVar341._8_4_ = 0x3f318000;
          auVar341._0_8_ = 0x3f3180003f318000;
          auVar341._12_4_ = 0x3f318000;
          auVar197 = vfmsub231ps_fma(auVar54,auVar159,auVar341);
          auVar235._8_4_ = 0xb95e8083;
          auVar235._0_8_ = 0xb95e8083b95e8083;
          auVar235._12_4_ = 0xb95e8083;
          auVar54 = vfnmsub231ps_fma(auVar197,auVar159,auVar235);
          auVar195._0_4_ = auVar54._0_4_ * auVar54._0_4_;
          auVar195._4_4_ = auVar54._4_4_ * auVar54._4_4_;
          auVar195._8_4_ = auVar54._8_4_ * auVar54._8_4_;
          auVar195._12_4_ = auVar54._12_4_ * auVar54._12_4_;
          auVar260._8_4_ = 0x39506967;
          auVar260._0_8_ = 0x3950696739506967;
          auVar260._12_4_ = 0x39506967;
          auVar197 = vfmadd213ps_fma(auVar260,auVar54,auVar353);
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar300);
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar247);
          auVar277._8_4_ = 0x3e2aaaaa;
          auVar277._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar277._12_4_ = 0x3e2aaaaa;
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar277);
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar223);
          auVar197 = vfmadd213ps_fma(auVar197,auVar195,auVar54);
          auVar196._0_4_ = auVar197._0_4_ + fVar102;
          auVar196._4_4_ = auVar197._4_4_ + fVar66;
          auVar196._8_4_ = auVar197._8_4_ + fVar298;
          auVar196._12_4_ = auVar197._12_4_ + fVar158;
          auVar106._0_4_ = (int)auVar159._0_4_;
          auVar106._4_4_ = (int)auVar159._4_4_;
          auVar106._8_4_ = (int)auVar159._8_4_;
          auVar106._12_4_ = (int)auVar159._12_4_;
          auVar159 = vpslld_avx(auVar106,0x17);
          auVar159 = vpaddd_avx(auVar159,auVar104);
          auVar73 = vfmadd213ps_fma(auVar159,auVar196,auVar104);
          auVar160._8_4_ = 0x800000;
          auVar160._0_8_ = 0x80000000800000;
          auVar160._12_4_ = 0x800000;
          auVar159 = vmaxps_avx(auVar73,auVar160);
          auVar197 = vpsrld_avx(auVar159,0x17);
          auVar261._8_4_ = 0xffffff82;
          auVar261._0_8_ = 0xffffff82ffffff82;
          auVar261._12_4_ = 0xffffff82;
          auVar197 = vpaddd_avx(auVar261,auVar197);
          auVar262._8_4_ = 0x807fffff;
          auVar262._0_8_ = 0x807fffff807fffff;
          auVar262._12_4_ = 0x807fffff;
          auVar159 = vandps_avx(auVar262,auVar159);
          auVar355 = vorps_avx(auVar159,auVar223);
          auVar54 = vcvtdq2ps_avx(auVar197);
          auVar263._8_4_ = 0x3f3504f3;
          auVar263._0_8_ = 0x3f3504f33f3504f3;
          auVar263._12_4_ = 0x3f3504f3;
          auVar197 = vcmpps_avx(auVar355,auVar263,1);
          auVar159 = vandps_avx(auVar197,auVar355);
          auVar161._0_4_ = auVar159._0_4_ + auVar355._0_4_ + -1.0;
          auVar161._4_4_ = auVar159._4_4_ + auVar355._4_4_ + -1.0;
          auVar161._8_4_ = auVar159._8_4_ + auVar355._8_4_ + -1.0;
          auVar161._12_4_ = auVar159._12_4_ + auVar355._12_4_ + -1.0;
          auVar159 = vandps_avx(auVar197,auVar104);
          auVar197 = vsubps_avx(auVar54,auVar159);
          auVar264._0_4_ = auVar161._0_4_ * auVar161._0_4_;
          auVar264._4_4_ = auVar161._4_4_ * auVar161._4_4_;
          auVar264._8_4_ = auVar161._8_4_ * auVar161._8_4_;
          auVar264._12_4_ = auVar161._12_4_ * auVar161._12_4_;
          auVar278._8_4_ = 0x3d9021bb;
          auVar278._0_8_ = 0x3d9021bb3d9021bb;
          auVar278._12_4_ = 0x3d9021bb;
          auVar322._8_4_ = 0xbdebd1b8;
          auVar322._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar322._12_4_ = 0xbdebd1b8;
          auVar159 = vfmadd213ps_fma(auVar278,auVar161,auVar322);
          auVar323._8_4_ = 0x3def251a;
          auVar323._0_8_ = 0x3def251a3def251a;
          auVar323._12_4_ = 0x3def251a;
          auVar159 = vfmadd213ps_fma(auVar159,auVar161,auVar323);
          auVar324._8_4_ = 0xbdfe5d4f;
          auVar324._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar324._12_4_ = 0xbdfe5d4f;
          auVar159 = vfmadd213ps_fma(auVar159,auVar161,auVar324);
          auVar325._8_4_ = 0x3e11e9bf;
          auVar325._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar325._12_4_ = 0x3e11e9bf;
          auVar159 = vfmadd213ps_fma(auVar159,auVar161,auVar325);
          auVar326._8_4_ = 0xbe2aae50;
          auVar326._0_8_ = 0xbe2aae50be2aae50;
          auVar326._12_4_ = 0xbe2aae50;
          auVar159 = vfmadd213ps_fma(auVar159,auVar161,auVar326);
          auVar327._8_4_ = 0x3e4cceac;
          auVar327._0_8_ = 0x3e4cceac3e4cceac;
          auVar327._12_4_ = 0x3e4cceac;
          auVar159 = vfmadd213ps_fma(auVar159,auVar161,auVar327);
          auVar328._8_4_ = 0xbe7ffffc;
          auVar328._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar328._12_4_ = 0xbe7ffffc;
          auVar159 = vfmadd213ps_fma(auVar159,auVar161,auVar328);
          auVar329._8_4_ = 0x3eaaaaaa;
          auVar329._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar329._12_4_ = 0x3eaaaaaa;
          auVar159 = vfmadd213ps_fma(auVar159,auVar161,auVar329);
          auVar279._0_4_ = auVar264._0_4_ * auVar161._0_4_ * auVar159._0_4_;
          auVar279._4_4_ = auVar264._4_4_ * auVar161._4_4_ * auVar159._4_4_;
          auVar279._8_4_ = auVar264._8_4_ * auVar161._8_4_ * auVar159._8_4_;
          auVar279._12_4_ = auVar264._12_4_ * auVar161._12_4_ * auVar159._12_4_;
          auVar159 = vfmadd231ps_fma(auVar279,auVar197,auVar235);
          auVar54 = vfmsub231ps_fma(auVar159,auVar223,auVar264);
          auVar159 = vcmpps_avx(auVar73,_DAT_005a14b0,2);
          auVar54 = vsubps_avx(auVar54,auVar161);
          auVar197 = vfnmadd231ps_fma(auVar54,auVar341,auVar197);
          auVar162._0_4_ = auVar197._0_4_ + auVar197._0_4_;
          auVar162._4_4_ = auVar197._4_4_ + auVar197._4_4_;
          auVar162._8_4_ = auVar197._8_4_ + auVar197._8_4_;
          auVar162._12_4_ = auVar197._12_4_ + auVar197._12_4_;
          auVar198._8_4_ = 0x7fffffff;
          auVar198._0_8_ = 0x7fffffff7fffffff;
          auVar198._12_4_ = 0x7fffffff;
          auVar159 = vblendvps_avx(auVar162,auVar198,auVar159);
          auVar163._8_4_ = 0x42b0c0a5;
          auVar163._0_8_ = 0x42b0c0a542b0c0a5;
          auVar163._12_4_ = 0x42b0c0a5;
          auVar159 = vminps_avx(auVar159,auVar163);
          auVar54 = vmaxps_avx(auVar347,auVar159);
          auVar159 = vfmadd213ps_fma(auVar363,auVar54,auVar223);
          auVar199._0_4_ = (int)auVar159._0_4_;
          auVar199._4_4_ = (int)auVar159._4_4_;
          auVar199._8_4_ = (int)auVar159._8_4_;
          auVar199._12_4_ = (int)auVar159._12_4_;
          auVar197 = vcvtdq2ps_avx(auVar199);
          auVar159 = vcmpps_avx(auVar159,auVar197,1);
          auVar159 = vandps_avx(auVar159,auVar104);
          auVar159 = vsubps_avx(auVar197,auVar159);
          auVar197 = vfmsub231ps_fma(auVar54,auVar159,auVar341);
          auVar54 = vfnmsub231ps_fma(auVar197,auVar159,auVar235);
          auVar246 = ZEXT1664(auVar104);
          auVar200._0_4_ = auVar54._0_4_ * auVar54._0_4_;
          auVar200._4_4_ = auVar54._4_4_ * auVar54._4_4_;
          auVar200._8_4_ = auVar54._8_4_ * auVar54._8_4_;
          auVar200._12_4_ = auVar54._12_4_ * auVar54._12_4_;
          auVar265._8_4_ = 0x39506967;
          auVar265._0_8_ = 0x3950696739506967;
          auVar265._12_4_ = 0x39506967;
          auVar197 = vfmadd213ps_fma(auVar265,auVar54,auVar353);
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar300);
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar247);
          auVar48._8_4_ = 0x3e2aaaaa;
          auVar48._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar48._12_4_ = 0x3e2aaaaa;
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar48);
          auVar197 = vfmadd213ps_fma(auVar197,auVar54,auVar223);
          auVar197 = vfmadd213ps_fma(auVar197,auVar200,auVar54);
          auVar107._0_4_ = auVar197._0_4_ + fVar102;
          auVar107._4_4_ = auVar197._4_4_ + fVar66;
          auVar107._8_4_ = auVar197._8_4_ + fVar298;
          auVar107._12_4_ = auVar197._12_4_ + fVar158;
          auVar164._0_4_ = (int)auVar159._0_4_;
          auVar164._4_4_ = (int)auVar159._4_4_;
          auVar164._8_4_ = (int)auVar159._8_4_;
          auVar164._12_4_ = (int)auVar159._12_4_;
          auVar159 = vpslld_avx(auVar164,0x17);
          auVar159 = vpaddd_avx(auVar159,auVar104);
          auVar104 = vfmadd213ps_fma(auVar159,auVar107,auVar104);
          auVar49._8_4_ = 0x40000000;
          auVar49._0_8_ = 0x4000000040000000;
          auVar49._12_4_ = 0x40000000;
          auVar104 = vdivps_avx(auVar49,auVar104);
          auVar69 = vfmsub231ps_fma(auVar69,auVar69,auVar104);
          break;
        case 6:
          puVar16 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar6 = *puVar16;
          auVar113._4_4_ = uVar6;
          auVar113._0_4_ = uVar6;
          auVar113._8_4_ = uVar6;
          auVar113._12_4_ = uVar6;
          uVar6 = puVar16[1];
          auVar169._4_4_ = uVar6;
          auVar169._0_4_ = uVar6;
          auVar169._8_4_ = uVar6;
          auVar169._12_4_ = uVar6;
          auVar159 = vfmadd231ps_fma(auVar169,auVar69,auVar113);
          auVar159 = vmaxps_avx(auVar159,_DAT_005a14b0);
          auVar104 = vminps_avx(auVar159,auVar104);
          auVar69._0_4_ = auVar104._0_4_ * auVar69._0_4_;
          auVar69._4_4_ = auVar104._4_4_ * auVar69._4_4_;
          auVar69._8_4_ = auVar104._8_4_ * auVar69._8_4_;
          auVar69._12_4_ = auVar104._12_4_ * auVar69._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar29 * 0x10) = auVar69;
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar32);
    }
    else {
      iVar26 = 0;
      if ((iVar27 != 8) || ((int)uVar32 < 1)) goto LAB_002e29f6;
      uVar29 = 0;
      auVar270._8_4_ = 0x3f000000;
      auVar270._0_8_ = 0x3f0000003f000000;
      auVar270._12_4_ = 0x3f000000;
      auVar270._16_4_ = 0x3f000000;
      auVar270._20_4_ = 0x3f000000;
      auVar270._24_4_ = 0x3f000000;
      auVar270._28_4_ = 0x3f000000;
      auVar246 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      do {
        auVar100 = ZEXT1664(ZEXT816(0) << 0x40);
        if (pvVar15 != (void *)0x0) {
          auVar100 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar15 + uVar29 * 0x20));
        }
        pauVar34 = (undefined1 (*) [32])
                   ((long)(this->weight_data_tm).w * uVar29 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        pauVar31 = (undefined1 (*) [32])local_138._0_8_;
        if ((int)uVar44 < 8) {
          auVar92 = SUB6432(ZEXT864(0),0);
          auVar90 = SUB6432(ZEXT864(0),0);
          auVar240 = SUB6432(ZEXT864(0),0);
          auVar62 = SUB6432(ZEXT864(0),0);
          auVar157 = ZEXT864(0);
          auVar191 = ZEXT864(0);
          auVar370 = ZEXT864(0);
          uVar28 = 0;
        }
        else {
          auVar370 = ZEXT864(0);
          iVar26 = 7;
          auVar191 = ZEXT864(0);
          auVar157 = ZEXT864(0);
          auVar339 = ZEXT864(0);
          auVar234 = ZEXT864(0);
          auVar346 = ZEXT864(0);
          auVar297 = ZEXT864(0);
          do {
            uVar6 = *(undefined4 *)*pauVar31;
            auVar348._4_4_ = uVar6;
            auVar348._0_4_ = uVar6;
            auVar348._8_4_ = uVar6;
            auVar348._12_4_ = uVar6;
            auVar348._16_4_ = uVar6;
            auVar348._20_4_ = uVar6;
            auVar348._24_4_ = uVar6;
            auVar348._28_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 4);
            auVar358._4_4_ = uVar6;
            auVar358._0_4_ = uVar6;
            auVar358._8_4_ = uVar6;
            auVar358._12_4_ = uVar6;
            auVar358._16_4_ = uVar6;
            auVar358._20_4_ = uVar6;
            auVar358._24_4_ = uVar6;
            auVar358._28_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 8);
            auVar304._4_4_ = uVar6;
            auVar304._0_4_ = uVar6;
            auVar304._8_4_ = uVar6;
            auVar304._12_4_ = uVar6;
            auVar304._16_4_ = uVar6;
            auVar304._20_4_ = uVar6;
            auVar304._24_4_ = uVar6;
            auVar304._28_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 0xc);
            auVar249._4_4_ = uVar6;
            auVar249._0_4_ = uVar6;
            auVar249._8_4_ = uVar6;
            auVar249._12_4_ = uVar6;
            auVar249._16_4_ = uVar6;
            auVar249._20_4_ = uVar6;
            auVar249._24_4_ = uVar6;
            auVar249._28_4_ = uVar6;
            auVar104 = vfmadd231ps_fma(auVar100._0_32_,auVar348,*pauVar34);
            auVar100 = ZEXT1664(auVar104);
            auVar104 = vfmadd231ps_fma(auVar370._0_32_,auVar358,pauVar34[1]);
            auVar370 = ZEXT1664(auVar104);
            auVar104 = vfmadd231ps_fma(auVar191._0_32_,auVar304,pauVar34[2]);
            auVar191 = ZEXT1664(auVar104);
            auVar104 = vfmadd231ps_fma(auVar157._0_32_,auVar249,pauVar34[3]);
            auVar157 = ZEXT1664(auVar104);
            uVar6 = *(undefined4 *)(*pauVar31 + 0x10);
            auVar250._4_4_ = uVar6;
            auVar250._0_4_ = uVar6;
            auVar250._8_4_ = uVar6;
            auVar250._12_4_ = uVar6;
            auVar250._16_4_ = uVar6;
            auVar250._20_4_ = uVar6;
            auVar250._24_4_ = uVar6;
            auVar250._28_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 0x14);
            auVar305._4_4_ = uVar6;
            auVar305._0_4_ = uVar6;
            auVar305._8_4_ = uVar6;
            auVar305._12_4_ = uVar6;
            auVar305._16_4_ = uVar6;
            auVar305._20_4_ = uVar6;
            auVar305._24_4_ = uVar6;
            auVar305._28_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 0x18);
            auVar349._4_4_ = uVar6;
            auVar349._0_4_ = uVar6;
            auVar349._8_4_ = uVar6;
            auVar349._12_4_ = uVar6;
            auVar349._16_4_ = uVar6;
            auVar349._20_4_ = uVar6;
            auVar349._24_4_ = uVar6;
            auVar349._28_4_ = uVar6;
            uVar6 = *(undefined4 *)(*pauVar31 + 0x1c);
            auVar359._4_4_ = uVar6;
            auVar359._0_4_ = uVar6;
            auVar359._8_4_ = uVar6;
            auVar359._12_4_ = uVar6;
            auVar359._16_4_ = uVar6;
            auVar359._20_4_ = uVar6;
            auVar359._24_4_ = uVar6;
            auVar359._28_4_ = uVar6;
            auVar104 = vfmadd231ps_fma(auVar339._0_32_,auVar250,pauVar34[4]);
            auVar339 = ZEXT1664(auVar104);
            auVar62 = ZEXT1632(auVar104);
            auVar104 = vfmadd231ps_fma(auVar234._0_32_,auVar305,pauVar34[5]);
            auVar234 = ZEXT1664(auVar104);
            auVar240 = ZEXT1632(auVar104);
            auVar104 = vfmadd231ps_fma(auVar346._0_32_,auVar349,pauVar34[6]);
            auVar346 = ZEXT1664(auVar104);
            auVar90 = ZEXT1632(auVar104);
            auVar104 = vfmadd231ps_fma(auVar297._0_32_,auVar359,pauVar34[7]);
            auVar297 = ZEXT1664(auVar104);
            auVar92 = ZEXT1632(auVar104);
            pauVar31 = pauVar31 + 1;
            pauVar34 = pauVar34 + 8;
            iVar26 = iVar26 + 8;
            uVar28 = uVar44 & 0xfffffff8;
          } while (iVar26 < (int)uVar44);
        }
        auVar242 = auVar370._0_32_;
        auVar174 = auVar191._0_32_;
        auVar156 = auVar157._0_32_;
        uVar39 = uVar28 | 3;
        while (auVar287 = auVar100._0_32_, (int)uVar39 < (int)uVar44) {
          uVar6 = *(undefined4 *)*pauVar31;
          auVar251._4_4_ = uVar6;
          auVar251._0_4_ = uVar6;
          auVar251._8_4_ = uVar6;
          auVar251._12_4_ = uVar6;
          auVar251._16_4_ = uVar6;
          auVar251._20_4_ = uVar6;
          auVar251._24_4_ = uVar6;
          auVar251._28_4_ = uVar6;
          uVar6 = *(undefined4 *)(*pauVar31 + 4);
          auVar306._4_4_ = uVar6;
          auVar306._0_4_ = uVar6;
          auVar306._8_4_ = uVar6;
          auVar306._12_4_ = uVar6;
          auVar306._16_4_ = uVar6;
          auVar306._20_4_ = uVar6;
          auVar306._24_4_ = uVar6;
          auVar306._28_4_ = uVar6;
          uVar6 = *(undefined4 *)(*pauVar31 + 8);
          auVar350._4_4_ = uVar6;
          auVar350._0_4_ = uVar6;
          auVar350._8_4_ = uVar6;
          auVar350._12_4_ = uVar6;
          auVar350._16_4_ = uVar6;
          auVar350._20_4_ = uVar6;
          auVar350._24_4_ = uVar6;
          auVar350._28_4_ = uVar6;
          uVar6 = *(undefined4 *)(*pauVar31 + 0xc);
          auVar360._4_4_ = uVar6;
          auVar360._0_4_ = uVar6;
          auVar360._8_4_ = uVar6;
          auVar360._12_4_ = uVar6;
          auVar360._16_4_ = uVar6;
          auVar360._20_4_ = uVar6;
          auVar360._24_4_ = uVar6;
          auVar360._28_4_ = uVar6;
          auVar104 = vfmadd231ps_fma(auVar287,auVar251,*pauVar34);
          auVar100 = ZEXT1664(auVar104);
          auVar104 = vfmadd231ps_fma(auVar370._0_32_,auVar306,pauVar34[1]);
          auVar370 = ZEXT1664(auVar104);
          auVar242 = ZEXT1632(auVar104);
          auVar104 = vfmadd231ps_fma(auVar191._0_32_,auVar350,pauVar34[2]);
          auVar191 = ZEXT1664(auVar104);
          auVar174 = ZEXT1632(auVar104);
          auVar104 = vfmadd231ps_fma(auVar157._0_32_,auVar360,pauVar34[3]);
          auVar157 = ZEXT1664(auVar104);
          auVar156 = ZEXT1632(auVar104);
          pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
          pauVar34 = pauVar34 + 4;
          uVar39 = uVar28 + 7;
          uVar28 = uVar28 + 4;
        }
        if (uVar44 - uVar28 != 0 && (int)uVar28 <= (int)uVar44) {
          lVar38 = 0;
          do {
            uVar6 = *(undefined4 *)(*pauVar31 + lVar38 * 4);
            auVar252._4_4_ = uVar6;
            auVar252._0_4_ = uVar6;
            auVar252._8_4_ = uVar6;
            auVar252._12_4_ = uVar6;
            auVar252._16_4_ = uVar6;
            auVar252._20_4_ = uVar6;
            auVar252._24_4_ = uVar6;
            auVar252._28_4_ = uVar6;
            auVar104 = vfmadd231ps_fma(auVar100._0_32_,auVar252,*pauVar34);
            auVar100 = ZEXT1664(auVar104);
            auVar287 = ZEXT1632(auVar104);
            pauVar34 = pauVar34 + 1;
            lVar38 = lVar38 + 1;
          } while (uVar44 - uVar28 != (int)lVar38);
        }
        fVar67 = auVar90._0_4_ + auVar92._0_4_ + auVar62._0_4_ + auVar240._0_4_ +
                 auVar242._0_4_ + auVar156._0_4_ + auVar174._0_4_ + auVar287._0_4_;
        fVar101 = auVar90._4_4_ + auVar92._4_4_ + auVar62._4_4_ + auVar240._4_4_ +
                  auVar242._4_4_ + auVar156._4_4_ + auVar174._4_4_ + auVar287._4_4_;
        auVar85._0_8_ = CONCAT44(fVar101,fVar67);
        auVar85._8_4_ =
             auVar90._8_4_ + auVar92._8_4_ + auVar62._8_4_ + auVar240._8_4_ +
             auVar242._8_4_ + auVar156._8_4_ + auVar174._8_4_ + auVar287._8_4_;
        auVar85._12_4_ =
             auVar90._12_4_ + auVar92._12_4_ + auVar62._12_4_ + auVar240._12_4_ +
             auVar242._12_4_ + auVar156._12_4_ + auVar174._12_4_ + auVar287._12_4_;
        auVar85._16_4_ =
             auVar90._16_4_ + auVar92._16_4_ + auVar62._16_4_ + auVar240._16_4_ +
             auVar242._16_4_ + auVar156._16_4_ + auVar174._16_4_ + auVar287._16_4_;
        auVar85._20_4_ =
             auVar90._20_4_ + auVar92._20_4_ + auVar62._20_4_ + auVar240._20_4_ +
             auVar242._20_4_ + auVar156._20_4_ + auVar174._20_4_ + auVar287._20_4_;
        auVar85._24_4_ =
             auVar90._24_4_ + auVar92._24_4_ + auVar62._24_4_ + auVar240._24_4_ +
             auVar242._24_4_ + auVar156._24_4_ + auVar174._24_4_ + auVar287._24_4_;
        auVar85._28_4_ =
             auVar90._28_4_ + auVar92._28_4_ + auVar62._28_4_ + auVar240._28_4_ +
             auVar242._28_4_ + auVar156._28_4_ + auVar174._28_4_ + auVar287._28_4_;
        auVar240 = auVar246._0_32_;
        fVar102 = auVar246._0_4_;
        fVar66 = auVar246._4_4_;
        fVar298 = auVar246._8_4_;
        fVar158 = auVar246._12_4_;
        fVar318 = auVar246._16_4_;
        fVar319 = auVar246._20_4_;
        fVar320 = auVar246._24_4_;
        fVar321 = auVar246._28_4_;
        switch(uVar13) {
        case 1:
          auVar85 = vmaxps_avx(auVar85,_DAT_005a5060);
          break;
        case 2:
          auVar240 = vmaxps_avx(auVar85,ZEXT1632(ZEXT816(0) << 0x40));
          auVar92 = vminps_avx(auVar85,ZEXT1632(ZEXT816(0) << 0x40));
          uVar6 = *(this->super_InnerProduct).activation_params.data;
          auVar89._4_4_ = uVar6;
          auVar89._0_4_ = uVar6;
          auVar89._8_4_ = uVar6;
          auVar89._12_4_ = uVar6;
          auVar89._16_4_ = uVar6;
          auVar89._20_4_ = uVar6;
          auVar89._24_4_ = uVar6;
          auVar89._28_4_ = uVar6;
          auVar104 = vfmadd213ps_fma(auVar89,auVar92,auVar240);
          auVar85 = ZEXT1632(auVar104);
          break;
        case 3:
          puVar16 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar6 = *puVar16;
          auVar139._4_4_ = uVar6;
          auVar139._0_4_ = uVar6;
          auVar139._8_4_ = uVar6;
          auVar139._12_4_ = uVar6;
          auVar139._16_4_ = uVar6;
          auVar139._20_4_ = uVar6;
          auVar139._24_4_ = uVar6;
          auVar139._28_4_ = uVar6;
          uVar6 = puVar16[1];
          auVar183._4_4_ = uVar6;
          auVar183._0_4_ = uVar6;
          auVar183._8_4_ = uVar6;
          auVar183._12_4_ = uVar6;
          auVar183._16_4_ = uVar6;
          auVar183._20_4_ = uVar6;
          auVar183._24_4_ = uVar6;
          auVar183._28_4_ = uVar6;
          auVar240 = vmaxps_avx(auVar85,auVar139);
          auVar85 = vminps_avx(auVar240,auVar183);
          break;
        case 4:
          auVar86._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
          auVar86._8_4_ = -auVar85._8_4_;
          auVar86._12_4_ = -auVar85._12_4_;
          auVar86._16_4_ = -auVar85._16_4_;
          auVar86._20_4_ = -auVar85._20_4_;
          auVar86._24_4_ = -auVar85._24_4_;
          auVar86._28_4_ = -auVar85._28_4_;
          auVar140._8_4_ = 0x42b0c0a5;
          auVar140._0_8_ = 0x42b0c0a542b0c0a5;
          auVar140._12_4_ = 0x42b0c0a5;
          auVar140._16_4_ = 0x42b0c0a5;
          auVar140._20_4_ = 0x42b0c0a5;
          auVar140._24_4_ = 0x42b0c0a5;
          auVar140._28_4_ = 0x42b0c0a5;
          auVar92 = vminps_avx(auVar86,auVar140);
          auVar141._8_4_ = 0xc2b0c0a5;
          auVar141._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar141._12_4_ = 0xc2b0c0a5;
          auVar141._16_4_ = 0xc2b0c0a5;
          auVar141._20_4_ = 0xc2b0c0a5;
          auVar141._24_4_ = 0xc2b0c0a5;
          auVar141._28_4_ = 0xc2b0c0a5;
          auVar62 = vmaxps_avx(auVar92,auVar141);
          auVar142._8_4_ = 0x3fb8aa3b;
          auVar142._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar142._12_4_ = 0x3fb8aa3b;
          auVar142._16_4_ = 0x3fb8aa3b;
          auVar142._20_4_ = 0x3fb8aa3b;
          auVar142._24_4_ = 0x3fb8aa3b;
          auVar142._28_4_ = 0x3fb8aa3b;
          auVar104 = vfmadd213ps_fma(auVar142,auVar62,auVar270);
          auVar90 = vroundps_avx(ZEXT1632(auVar104),1);
          auVar92 = vcmpps_avx(ZEXT1632(auVar104),auVar90,1);
          auVar92 = vandps_avx(auVar92,auVar240);
          auVar92 = vsubps_avx(auVar90,auVar92);
          auVar184._8_4_ = 0x3f318000;
          auVar184._0_8_ = 0x3f3180003f318000;
          auVar184._12_4_ = 0x3f318000;
          auVar184._16_4_ = 0x3f318000;
          auVar184._20_4_ = 0x3f318000;
          auVar184._24_4_ = 0x3f318000;
          auVar184._28_4_ = 0x3f318000;
          auVar104 = vfmsub231ps_fma(auVar62,auVar92,auVar184);
          auVar185._8_4_ = 0x395e8083;
          auVar185._0_8_ = 0x395e8083395e8083;
          auVar185._12_4_ = 0x395e8083;
          auVar185._16_4_ = 0x395e8083;
          auVar185._20_4_ = 0x395e8083;
          auVar185._24_4_ = 0x395e8083;
          auVar185._28_4_ = 0x395e8083;
          auVar159 = vfmsub231ps_fma(ZEXT1632(auVar104),auVar92,auVar185);
          auVar62 = ZEXT1632(auVar159);
          auVar21._28_4_ = 0x395e8083;
          auVar21._0_28_ =
               ZEXT1628(CONCAT412(auVar159._12_4_ * auVar159._12_4_,
                                  CONCAT48(auVar159._8_4_ * auVar159._8_4_,
                                           CONCAT44(auVar159._4_4_ * auVar159._4_4_,
                                                    auVar159._0_4_ * auVar159._0_4_))));
          auVar233._8_4_ = 0x39506967;
          auVar233._0_8_ = 0x3950696739506967;
          auVar233._12_4_ = 0x39506967;
          auVar233._16_4_ = 0x39506967;
          auVar233._20_4_ = 0x39506967;
          auVar233._24_4_ = 0x39506967;
          auVar233._28_4_ = 0x39506967;
          auVar256._8_4_ = 0x3ab743ce;
          auVar256._0_8_ = 0x3ab743ce3ab743ce;
          auVar256._12_4_ = 0x3ab743ce;
          auVar256._16_4_ = 0x3ab743ce;
          auVar256._20_4_ = 0x3ab743ce;
          auVar256._24_4_ = 0x3ab743ce;
          auVar256._28_4_ = 0x3ab743ce;
          auVar104 = vfmadd213ps_fma(auVar233,auVar62,auVar256);
          auVar215._8_4_ = 0x3c088908;
          auVar215._0_8_ = 0x3c0889083c088908;
          auVar215._12_4_ = 0x3c088908;
          auVar215._16_4_ = 0x3c088908;
          auVar215._20_4_ = 0x3c088908;
          auVar215._24_4_ = 0x3c088908;
          auVar215._28_4_ = 0x3c088908;
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar62,auVar215);
          auVar216._8_4_ = 0x3d2aa9c1;
          auVar216._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar216._12_4_ = 0x3d2aa9c1;
          auVar216._16_4_ = 0x3d2aa9c1;
          auVar216._20_4_ = 0x3d2aa9c1;
          auVar216._24_4_ = 0x3d2aa9c1;
          auVar216._28_4_ = 0x3d2aa9c1;
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar62,auVar216);
          auVar60._8_4_ = 0x3e2aaaaa;
          auVar60._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar60._12_4_ = 0x3e2aaaaa;
          auVar60._16_4_ = 0x3e2aaaaa;
          auVar60._20_4_ = 0x3e2aaaaa;
          auVar60._24_4_ = 0x3e2aaaaa;
          auVar60._28_4_ = 0x3e2aaaaa;
          auVar62 = ZEXT1632(auVar159);
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar62,auVar60);
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar62,auVar270);
          auVar197 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar21,auVar62);
          auVar68._0_4_ = (int)auVar92._0_4_;
          auVar68._4_4_ = (int)auVar92._4_4_;
          auVar68._8_4_ = (int)auVar92._8_4_;
          auVar68._12_4_ = (int)auVar92._12_4_;
          auVar87._16_4_ = (int)auVar92._16_4_;
          auVar87._0_16_ = auVar68;
          auVar87._20_4_ = (int)auVar92._20_4_;
          auVar87._24_4_ = (int)auVar92._24_4_;
          auVar87._28_4_ = (int)auVar92._28_4_;
          auVar159 = vpslld_avx(auVar68,0x17);
          auVar104 = vpslld_avx(auVar87._16_16_,0x17);
          auVar47._8_4_ = 0x3f800000;
          auVar47._0_8_ = 0x3f8000003f800000;
          auVar47._12_4_ = 0x3f800000;
          auVar104 = vpaddd_avx(auVar104,auVar47);
          auVar159 = vpaddd_avx(auVar159,auVar47);
          auVar88._16_16_ = auVar104;
          auVar88._0_16_ = auVar159;
          auVar143._0_4_ = auVar197._0_4_ + fVar102;
          auVar143._4_4_ = auVar197._4_4_ + fVar66;
          auVar143._8_4_ = auVar197._8_4_ + fVar298;
          auVar143._12_4_ = auVar197._12_4_ + fVar158;
          auVar143._16_4_ = fVar318 + 0.0;
          auVar143._20_4_ = fVar319 + 0.0;
          auVar143._24_4_ = fVar320 + 0.0;
          auVar143._28_4_ = fVar321 + 0.0;
          auVar104 = vfmadd213ps_fma(auVar88,auVar143,auVar240);
          auVar85 = vdivps_avx(auVar240,ZEXT1632(auVar104));
          break;
        case 5:
          auVar333._8_4_ = 0x42b0c0a5;
          auVar333._0_8_ = 0x42b0c0a542b0c0a5;
          auVar333._12_4_ = 0x42b0c0a5;
          auVar333._16_4_ = 0x42b0c0a5;
          auVar333._20_4_ = 0x42b0c0a5;
          auVar333._24_4_ = 0x42b0c0a5;
          auVar333._28_4_ = 0x42b0c0a5;
          auVar92 = vminps_avx(auVar333,auVar85);
          auVar342._8_4_ = 0xc2b0c0a5;
          auVar342._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar342._12_4_ = 0xc2b0c0a5;
          auVar342._16_4_ = 0xc2b0c0a5;
          auVar342._20_4_ = 0xc2b0c0a5;
          auVar342._24_4_ = 0xc2b0c0a5;
          auVar342._28_4_ = 0xc2b0c0a5;
          auVar62 = vmaxps_avx(auVar342,auVar92);
          auVar175._8_4_ = 0x3fb8aa3b;
          auVar175._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar175._12_4_ = 0x3fb8aa3b;
          auVar175._16_4_ = 0x3fb8aa3b;
          auVar175._20_4_ = 0x3fb8aa3b;
          auVar175._24_4_ = 0x3fb8aa3b;
          auVar175._28_4_ = 0x3fb8aa3b;
          auVar104 = vfmadd213ps_fma(auVar175,auVar62,auVar270);
          auVar90 = vroundps_avx(ZEXT1632(auVar104),1);
          auVar92 = vcmpps_avx(ZEXT1632(auVar104),auVar90,1);
          auVar92 = vandps_avx(auVar92,auVar240);
          auVar92 = vsubps_avx(auVar90,auVar92);
          auVar361._8_4_ = 0x3f318000;
          auVar361._0_8_ = 0x3f3180003f318000;
          auVar361._12_4_ = 0x3f318000;
          auVar361._16_4_ = 0x3f318000;
          auVar361._20_4_ = 0x3f318000;
          auVar361._24_4_ = 0x3f318000;
          auVar361._28_4_ = 0x3f318000;
          auVar104 = vfmsub231ps_fma(auVar62,auVar92,auVar361);
          auVar343._8_4_ = 0xb95e8083;
          auVar343._0_8_ = 0xb95e8083b95e8083;
          auVar343._12_4_ = 0xb95e8083;
          auVar343._16_4_ = 0xb95e8083;
          auVar343._20_4_ = 0xb95e8083;
          auVar343._24_4_ = 0xb95e8083;
          auVar343._28_4_ = 0xb95e8083;
          auVar159 = vfnmsub231ps_fma(ZEXT1632(auVar104),auVar92,auVar343);
          auVar62 = ZEXT1632(auVar159);
          auVar19._28_4_ = auVar90._28_4_;
          auVar19._0_28_ =
               ZEXT1628(CONCAT412(auVar159._12_4_ * auVar159._12_4_,
                                  CONCAT48(auVar159._8_4_ * auVar159._8_4_,
                                           CONCAT44(auVar159._4_4_ * auVar159._4_4_,
                                                    auVar159._0_4_ * auVar159._0_4_))));
          auVar253._8_4_ = 0x39506967;
          auVar253._0_8_ = 0x3950696739506967;
          auVar253._12_4_ = 0x39506967;
          auVar253._16_4_ = 0x39506967;
          auVar253._20_4_ = 0x39506967;
          auVar253._24_4_ = 0x39506967;
          auVar253._28_4_ = 0x39506967;
          auVar367._8_4_ = 0x3ab743ce;
          auVar367._0_8_ = 0x3ab743ce3ab743ce;
          auVar367._12_4_ = 0x3ab743ce;
          auVar367._16_4_ = 0x3ab743ce;
          auVar367._20_4_ = 0x3ab743ce;
          auVar367._24_4_ = 0x3ab743ce;
          auVar367._28_4_ = 0x3ab743ce;
          auVar104 = vfmadd213ps_fma(auVar253,auVar62,auVar367);
          auVar351._8_4_ = 0x3c088908;
          auVar351._0_8_ = 0x3c0889083c088908;
          auVar351._12_4_ = 0x3c088908;
          auVar351._16_4_ = 0x3c088908;
          auVar351._20_4_ = 0x3c088908;
          auVar351._24_4_ = 0x3c088908;
          auVar351._28_4_ = 0x3c088908;
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar62,auVar351);
          auVar241._8_4_ = 0x3d2aa9c1;
          auVar241._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar241._12_4_ = 0x3d2aa9c1;
          auVar241._16_4_ = 0x3d2aa9c1;
          auVar241._20_4_ = 0x3d2aa9c1;
          auVar241._24_4_ = 0x3d2aa9c1;
          auVar241._28_4_ = 0x3d2aa9c1;
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar62,auVar241);
          auVar368._8_4_ = 0x3e2aaaaa;
          auVar368._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar368._12_4_ = 0x3e2aaaaa;
          auVar368._16_4_ = 0x3e2aaaaa;
          auVar368._20_4_ = 0x3e2aaaaa;
          auVar368._24_4_ = 0x3e2aaaaa;
          auVar368._28_4_ = 0x3e2aaaaa;
          auVar62 = ZEXT1632(auVar159);
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar62,auVar368);
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar62,auVar270);
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar19,auVar62);
          auVar230._0_4_ = auVar104._0_4_ + fVar102;
          auVar230._4_4_ = auVar104._4_4_ + fVar66;
          auVar230._8_4_ = auVar104._8_4_ + fVar298;
          auVar230._12_4_ = auVar104._12_4_ + fVar158;
          auVar230._16_4_ = fVar318 + 0.0;
          auVar230._20_4_ = fVar319 + 0.0;
          auVar230._24_4_ = fVar320 + 0.0;
          auVar230._28_4_ = fVar321 + 0.0;
          auVar103._0_4_ = (int)auVar92._0_4_;
          auVar103._4_4_ = (int)auVar92._4_4_;
          auVar103._8_4_ = (int)auVar92._8_4_;
          auVar103._12_4_ = (int)auVar92._12_4_;
          auVar135._16_4_ = (int)auVar92._16_4_;
          auVar135._0_16_ = auVar103;
          auVar135._20_4_ = (int)auVar92._20_4_;
          auVar135._24_4_ = (int)auVar92._24_4_;
          auVar135._28_4_ = (int)auVar92._28_4_;
          auVar159 = vpslld_avx(auVar103,0x17);
          auVar104 = vpslld_avx(auVar135._16_16_,0x17);
          auVar192._8_4_ = 0x3f800000;
          auVar192._0_8_ = 0x3f8000003f800000;
          auVar192._12_4_ = 0x3f800000;
          auVar104 = vpaddd_avx(auVar104,auVar192);
          auVar159 = vpaddd_avx(auVar159,auVar192);
          auVar136._16_16_ = auVar104;
          auVar136._0_16_ = auVar159;
          auVar197 = vfmadd213ps_fma(auVar136,auVar230,auVar240);
          auVar176._8_4_ = 0x800000;
          auVar176._0_8_ = 0x80000000800000;
          auVar176._12_4_ = 0x800000;
          auVar176._16_4_ = 0x800000;
          auVar176._20_4_ = 0x800000;
          auVar176._24_4_ = 0x800000;
          auVar176._28_4_ = 0x800000;
          auVar92 = vmaxps_avx(ZEXT1632(auVar197),auVar176);
          auVar159 = vpsrld_avx(auVar92._0_16_,0x17);
          auVar104 = vpsrld_avx(auVar92._16_16_,0x17);
          auVar280._8_4_ = 0x807fffff;
          auVar280._0_8_ = 0x807fffff807fffff;
          auVar280._12_4_ = 0x807fffff;
          auVar280._16_4_ = 0x807fffff;
          auVar280._20_4_ = 0x807fffff;
          auVar280._24_4_ = 0x807fffff;
          auVar280._28_4_ = 0x807fffff;
          auVar92 = vandps_avx(auVar280,auVar92);
          auVar90 = vorps_avx(auVar270,auVar92);
          auVar281._8_4_ = 0x3f3504f3;
          auVar281._0_8_ = 0x3f3504f33f3504f3;
          auVar281._12_4_ = 0x3f3504f3;
          auVar281._16_4_ = 0x3f3504f3;
          auVar281._20_4_ = 0x3f3504f3;
          auVar281._24_4_ = 0x3f3504f3;
          auVar281._28_4_ = 0x3f3504f3;
          auVar62 = vcmpps_avx(auVar281,auVar90,2);
          auVar92 = vandnps_avx(auVar62,auVar90);
          auVar334._8_4_ = 0xbf800000;
          auVar334._0_8_ = 0xbf800000bf800000;
          auVar334._12_4_ = 0xbf800000;
          auVar334._16_4_ = 0xbf800000;
          auVar334._20_4_ = 0xbf800000;
          auVar334._24_4_ = 0xbf800000;
          auVar334._28_4_ = 0xbf800000;
          auVar177._0_4_ = auVar92._0_4_ + auVar90._0_4_ + -1.0;
          auVar177._4_4_ = auVar92._4_4_ + auVar90._4_4_ + -1.0;
          auVar177._8_4_ = auVar92._8_4_ + auVar90._8_4_ + -1.0;
          auVar177._12_4_ = auVar92._12_4_ + auVar90._12_4_ + -1.0;
          auVar177._16_4_ = auVar92._16_4_ + auVar90._16_4_ + -1.0;
          auVar177._20_4_ = auVar92._20_4_ + auVar90._20_4_ + -1.0;
          auVar177._24_4_ = auVar92._24_4_ + auVar90._24_4_ + -1.0;
          auVar177._28_4_ = auVar92._28_4_ + auVar90._28_4_ + -1.0;
          auVar104 = vpsubd_avx(auVar104,auVar62._16_16_);
          auVar299._8_4_ = 0xffffff81;
          auVar299._0_8_ = 0xffffff81ffffff81;
          auVar299._12_4_ = 0xffffff81;
          auVar104 = vpaddd_avx(auVar299,auVar104);
          auVar159 = vpsubd_avx(auVar159,auVar62._0_16_);
          auVar159 = vpaddd_avx(auVar299,auVar159);
          auVar231._16_16_ = auVar104;
          auVar231._0_16_ = auVar159;
          auVar254._0_4_ = auVar177._0_4_ * auVar177._0_4_;
          auVar254._4_4_ = auVar177._4_4_ * auVar177._4_4_;
          auVar254._8_4_ = auVar177._8_4_ * auVar177._8_4_;
          auVar254._12_4_ = auVar177._12_4_ * auVar177._12_4_;
          auVar254._16_4_ = auVar177._16_4_ * auVar177._16_4_;
          auVar254._20_4_ = auVar177._20_4_ * auVar177._20_4_;
          auVar254._24_4_ = auVar177._24_4_ * auVar177._24_4_;
          auVar254._28_4_ = 0;
          auVar282._8_4_ = 0x3d9021bb;
          auVar282._0_8_ = 0x3d9021bb3d9021bb;
          auVar282._12_4_ = 0x3d9021bb;
          auVar282._16_4_ = 0x3d9021bb;
          auVar282._20_4_ = 0x3d9021bb;
          auVar282._24_4_ = 0x3d9021bb;
          auVar282._28_4_ = 0x3d9021bb;
          auVar307._8_4_ = 0xbdebd1b8;
          auVar307._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar307._12_4_ = 0xbdebd1b8;
          auVar307._16_4_ = 0xbdebd1b8;
          auVar307._20_4_ = 0xbdebd1b8;
          auVar307._24_4_ = 0xbdebd1b8;
          auVar307._28_4_ = 0xbdebd1b8;
          auVar104 = vfmadd213ps_fma(auVar282,auVar177,auVar307);
          auVar308._8_4_ = 0x3def251a;
          auVar308._0_8_ = 0x3def251a3def251a;
          auVar308._12_4_ = 0x3def251a;
          auVar308._16_4_ = 0x3def251a;
          auVar308._20_4_ = 0x3def251a;
          auVar308._24_4_ = 0x3def251a;
          auVar308._28_4_ = 0x3def251a;
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar177,auVar308);
          auVar309._8_4_ = 0xbdfe5d4f;
          auVar309._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar309._12_4_ = 0xbdfe5d4f;
          auVar309._16_4_ = 0xbdfe5d4f;
          auVar309._20_4_ = 0xbdfe5d4f;
          auVar309._24_4_ = 0xbdfe5d4f;
          auVar309._28_4_ = 0xbdfe5d4f;
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar177,auVar309);
          auVar310._8_4_ = 0x3e11e9bf;
          auVar310._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar310._12_4_ = 0x3e11e9bf;
          auVar310._16_4_ = 0x3e11e9bf;
          auVar310._20_4_ = 0x3e11e9bf;
          auVar310._24_4_ = 0x3e11e9bf;
          auVar310._28_4_ = 0x3e11e9bf;
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar177,auVar310);
          auVar311._8_4_ = 0xbe2aae50;
          auVar311._0_8_ = 0xbe2aae50be2aae50;
          auVar311._12_4_ = 0xbe2aae50;
          auVar311._16_4_ = 0xbe2aae50;
          auVar311._20_4_ = 0xbe2aae50;
          auVar311._24_4_ = 0xbe2aae50;
          auVar311._28_4_ = 0xbe2aae50;
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar177,auVar311);
          auVar312._8_4_ = 0x3e4cceac;
          auVar312._0_8_ = 0x3e4cceac3e4cceac;
          auVar312._12_4_ = 0x3e4cceac;
          auVar312._16_4_ = 0x3e4cceac;
          auVar312._20_4_ = 0x3e4cceac;
          auVar312._24_4_ = 0x3e4cceac;
          auVar312._28_4_ = 0x3e4cceac;
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar177,auVar312);
          auVar313._8_4_ = 0xbe7ffffc;
          auVar313._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar313._12_4_ = 0xbe7ffffc;
          auVar313._16_4_ = 0xbe7ffffc;
          auVar313._20_4_ = 0xbe7ffffc;
          auVar313._24_4_ = 0xbe7ffffc;
          auVar313._28_4_ = 0xbe7ffffc;
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar177,auVar313);
          auVar314._8_4_ = 0x3eaaaaaa;
          auVar314._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar314._12_4_ = 0x3eaaaaaa;
          auVar314._16_4_ = 0x3eaaaaaa;
          auVar314._20_4_ = 0x3eaaaaaa;
          auVar314._24_4_ = 0x3eaaaaaa;
          auVar314._28_4_ = 0x3eaaaaaa;
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar177,auVar314);
          auVar283._0_4_ = auVar254._0_4_ * auVar177._0_4_ * auVar104._0_4_;
          auVar283._4_4_ = auVar254._4_4_ * auVar177._4_4_ * auVar104._4_4_;
          auVar283._8_4_ = auVar254._8_4_ * auVar177._8_4_ * auVar104._8_4_;
          auVar283._12_4_ = auVar254._12_4_ * auVar177._12_4_ * auVar104._12_4_;
          auVar283._16_4_ = auVar254._16_4_ * auVar177._16_4_ * 0.0;
          auVar283._20_4_ = auVar254._20_4_ * auVar177._20_4_ * 0.0;
          auVar283._24_4_ = auVar254._24_4_ * auVar177._24_4_ * 0.0;
          auVar283._28_4_ = 0;
          auVar62 = vcvtdq2ps_avx(auVar231);
          auVar104 = vfmadd231ps_fma(auVar283,auVar62,auVar343);
          auVar104 = vfmsub231ps_fma(ZEXT1632(auVar104),auVar270,auVar254);
          auVar92 = vcmpps_avx(ZEXT1632(auVar197),_DAT_005a5060,2);
          auVar90 = vsubps_avx(ZEXT1632(auVar104),auVar177);
          auVar104 = vfmsub231ps_fma(auVar90,auVar361,auVar62);
          auVar284._8_4_ = 0xc0000000;
          auVar284._0_8_ = 0xc0000000c0000000;
          auVar284._12_4_ = 0xc0000000;
          auVar284._16_4_ = 0xc0000000;
          auVar284._20_4_ = 0xc0000000;
          auVar284._24_4_ = 0xc0000000;
          auVar284._28_4_ = 0xc0000000;
          auVar178._0_4_ = auVar104._0_4_ * -2.0;
          auVar178._4_4_ = auVar104._4_4_ * -2.0;
          auVar178._8_4_ = auVar104._8_4_ * -2.0;
          auVar178._12_4_ = auVar104._12_4_ * -2.0;
          auVar178._16_4_ = 0x80000000;
          auVar178._20_4_ = 0x80000000;
          auVar178._24_4_ = 0x80000000;
          auVar178._28_4_ = 0;
          auVar232._8_4_ = 0x7fffffff;
          auVar232._0_8_ = 0x7fffffff7fffffff;
          auVar232._12_4_ = 0x7fffffff;
          auVar232._16_4_ = 0x7fffffff;
          auVar232._20_4_ = 0x7fffffff;
          auVar232._24_4_ = 0x7fffffff;
          auVar232._28_4_ = 0x7fffffff;
          auVar92 = vblendvps_avx(auVar178,auVar232,auVar92);
          auVar179._8_4_ = 0x42b0c0a5;
          auVar179._0_8_ = 0x42b0c0a542b0c0a5;
          auVar179._12_4_ = 0x42b0c0a5;
          auVar179._16_4_ = 0x42b0c0a5;
          auVar179._20_4_ = 0x42b0c0a5;
          auVar179._24_4_ = 0x42b0c0a5;
          auVar179._28_4_ = 0x42b0c0a5;
          auVar92 = vminps_avx(auVar92,auVar179);
          auVar180._8_4_ = 0xc2b0c0a5;
          auVar180._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar180._12_4_ = 0xc2b0c0a5;
          auVar180._16_4_ = 0xc2b0c0a5;
          auVar180._20_4_ = 0xc2b0c0a5;
          auVar180._24_4_ = 0xc2b0c0a5;
          auVar180._28_4_ = 0xc2b0c0a5;
          auVar62 = vmaxps_avx(auVar92,auVar180);
          auVar181._8_4_ = 0x3fb8aa3b;
          auVar181._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar181._12_4_ = 0x3fb8aa3b;
          auVar181._16_4_ = 0x3fb8aa3b;
          auVar181._20_4_ = 0x3fb8aa3b;
          auVar181._24_4_ = 0x3fb8aa3b;
          auVar181._28_4_ = 0x3fb8aa3b;
          auVar104 = vfmadd213ps_fma(auVar181,auVar62,auVar270);
          auVar90 = vroundps_avx(ZEXT1632(auVar104),1);
          auVar92 = vcmpps_avx(ZEXT1632(auVar104),auVar90,1);
          auVar92 = vandps_avx(auVar92,auVar240);
          auVar92 = vsubps_avx(auVar90,auVar92);
          auVar104 = vfmsub231ps_fma(auVar62,auVar92,auVar361);
          auVar159 = vfnmsub231ps_fma(ZEXT1632(auVar104),auVar92,auVar343);
          auVar62 = ZEXT1632(auVar159);
          auVar20._28_4_ = auVar90._28_4_;
          auVar20._0_28_ =
               ZEXT1628(CONCAT412(auVar159._12_4_ * auVar159._12_4_,
                                  CONCAT48(auVar159._8_4_ * auVar159._8_4_,
                                           CONCAT44(auVar159._4_4_ * auVar159._4_4_,
                                                    auVar159._0_4_ * auVar159._0_4_))));
          auVar255._8_4_ = 0x39506967;
          auVar255._0_8_ = 0x3950696739506967;
          auVar255._12_4_ = 0x39506967;
          auVar255._16_4_ = 0x39506967;
          auVar255._20_4_ = 0x39506967;
          auVar255._24_4_ = 0x39506967;
          auVar255._28_4_ = 0x39506967;
          auVar315._8_4_ = 0x3ab743ce;
          auVar315._0_8_ = 0x3ab743ce3ab743ce;
          auVar315._12_4_ = 0x3ab743ce;
          auVar315._16_4_ = 0x3ab743ce;
          auVar315._20_4_ = 0x3ab743ce;
          auVar315._24_4_ = 0x3ab743ce;
          auVar315._28_4_ = 0x3ab743ce;
          auVar104 = vfmadd213ps_fma(auVar255,auVar62,auVar315);
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar62,auVar351);
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar62,auVar241);
          auVar246 = ZEXT3264(auVar240);
          auVar62 = ZEXT1632(auVar159);
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar62,auVar368);
          auVar104 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar62,auVar270);
          auVar197 = vfmadd213ps_fma(ZEXT1632(auVar104),auVar20,auVar62);
          auVar105._0_4_ = (int)auVar92._0_4_;
          auVar105._4_4_ = (int)auVar92._4_4_;
          auVar105._8_4_ = (int)auVar92._8_4_;
          auVar105._12_4_ = (int)auVar92._12_4_;
          auVar137._16_4_ = (int)auVar92._16_4_;
          auVar137._0_16_ = auVar105;
          auVar137._20_4_ = (int)auVar92._20_4_;
          auVar137._24_4_ = (int)auVar92._24_4_;
          auVar137._28_4_ = (int)auVar92._28_4_;
          auVar159 = vpslld_avx(auVar105,0x17);
          auVar104 = vpslld_avx(auVar137._16_16_,0x17);
          auVar104 = vpaddd_avx(auVar104,auVar192);
          auVar159 = vpaddd_avx(auVar159,auVar192);
          auVar138._16_16_ = auVar104;
          auVar138._0_16_ = auVar159;
          auVar182._0_4_ = auVar197._0_4_ + fVar102;
          auVar182._4_4_ = auVar197._4_4_ + fVar66;
          auVar182._8_4_ = auVar197._8_4_ + fVar298;
          auVar182._12_4_ = auVar197._12_4_ + fVar158;
          auVar182._16_4_ = fVar318 + 0.0;
          auVar182._20_4_ = fVar319 + 0.0;
          auVar182._24_4_ = fVar320 + 0.0;
          auVar182._28_4_ = fVar321 + 0.0;
          auVar104 = vfmadd213ps_fma(auVar138,auVar182,auVar240);
          auVar240 = vdivps_avx(auVar240,ZEXT1632(auVar104));
          auVar104 = vfnmadd213ps_fma(auVar240,auVar284,auVar334);
          auVar134 = ZEXT1628(auVar104);
          goto LAB_002e11da;
        case 6:
          puVar16 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar6 = *puVar16;
          auVar144._4_4_ = uVar6;
          auVar144._0_4_ = uVar6;
          auVar144._8_4_ = uVar6;
          auVar144._12_4_ = uVar6;
          auVar144._16_4_ = uVar6;
          auVar144._20_4_ = uVar6;
          auVar144._24_4_ = uVar6;
          auVar144._28_4_ = uVar6;
          uVar6 = puVar16[1];
          auVar186._4_4_ = uVar6;
          auVar186._0_4_ = uVar6;
          auVar186._8_4_ = uVar6;
          auVar186._12_4_ = uVar6;
          auVar186._16_4_ = uVar6;
          auVar186._20_4_ = uVar6;
          auVar186._24_4_ = uVar6;
          auVar186._28_4_ = uVar6;
          auVar104 = vfmadd231ps_fma(auVar186,auVar85,auVar144);
          auVar92 = vmaxps_avx(ZEXT1632(auVar104),_DAT_005a5060);
          auVar240 = vminps_avx(auVar92,auVar240);
          auVar134 = auVar240._0_28_;
LAB_002e11da:
          auVar85._4_4_ = auVar134._4_4_ * fVar101;
          auVar85._0_4_ = auVar134._0_4_ * fVar67;
          auVar85._8_4_ = auVar134._8_4_ * auVar85._8_4_;
          auVar85._12_4_ = auVar134._12_4_ * auVar85._12_4_;
          auVar85._16_4_ = auVar134._16_4_ * auVar85._16_4_;
          auVar85._20_4_ = auVar134._20_4_ * auVar85._20_4_;
          auVar85._24_4_ = auVar134._24_4_ * auVar85._24_4_;
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar29 * 0x20) = auVar85;
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar32);
    }
    iVar26 = 0;
  }
LAB_002e29f6:
  if ((int *)local_138._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_138._8_8_ = *(int *)local_138._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_138._8_8_ == 0) {
      if (local_118 == (Allocator *)0x0) {
        if ((void *)local_138._0_8_ != (void *)0x0) {
          free((void *)local_138._0_8_);
        }
      }
      else {
        (*local_118->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int InnerProduct_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}